

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSystemTools.cxx
# Opt level: O1

int testSystemTools(int param_1,char **param_2)

{
  char cVar1;
  uint3 uVar2;
  long lVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  int iVar39;
  ostream *poVar40;
  size_t sVar41;
  undefined7 extraout_var;
  long *plVar42;
  undefined7 extraout_var_00;
  Status SVar43;
  pointer pcVar44;
  pointer *ppbVar45;
  long *plVar46;
  undefined8 uVar47;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar48;
  string *password;
  size_type size;
  pointer pbVar49;
  bool *pbVar50;
  char **ppcVar51;
  byte bVar52;
  undefined4 uVar53;
  uint uVar54;
  ulong uVar55;
  char *pcVar56;
  undefined8 in_R8;
  byte bVar57;
  long lVar58;
  ulong uVar59;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  CopyStatus CVar60;
  initializer_list<const_char_*> expected;
  initializer_list<const_char_*> expected_00;
  initializer_list<const_char_*> expected_01;
  initializer_list<const_char_*> expected_02;
  byte local_509;
  size_type __dnew_1;
  pointer local_500;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  originalPaths;
  string output;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  byte local_454;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linesToJoin;
  string joinResult;
  undefined4 *local_410;
  undefined8 local_408;
  undefined4 local_400 [4];
  undefined2 *local_3f0;
  undefined8 local_3e8;
  undefined2 local_3e0 [8];
  undefined4 *local_3d0;
  undefined8 local_3c8;
  undefined4 local_3c0;
  undefined2 uStack_3bc;
  undefined1 uStack_3ba;
  long *local_3b0 [2];
  undefined8 local_3a0;
  ios_base local_338 [272];
  string test;
  ios_base local_1a8 [276];
  undefined4 local_94;
  size_type __dnew_2;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  uint local_70;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  undefined8 local_60;
  size_type __dnew_16;
  string local_50;
  
  local_509 = 1;
  pcVar56 = "/usr/local/bin/passwd";
  lVar58 = 0x10;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&joinResult,pcVar56,(allocator<char> *)&__dnew_1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test,
               *(char **)((long)&cmakeGeneratedFunctionMapEntries[0xb].func + lVar58),
               (allocator<char> *)&originalPaths);
    bVar6 = CheckConvertToUnixSlashes(&joinResult,&test);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)test._M_dataplus._M_p != &test.field_2) {
      operator_delete(test._M_dataplus._M_p,
                      CONCAT17(test.field_2._M_local_buf[7],
                               CONCAT16(test.field_2._M_local_buf[6],
                                        CONCAT15(test.field_2._M_local_buf[5],
                                                 CONCAT14(test.field_2._M_local_buf[4],
                                                          CONCAT13(test.field_2._M_local_buf[3],
                                                                   CONCAT12(test.field_2.
                                                                            _M_local_buf[2],
                                                                            CONCAT11(test.field_2.
                                                                                     _M_local_buf[1]
                                                                                     ,test.field_2.
                                                                                      _M_local_buf
                                                                                      [0]))))))) + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
      operator_delete(joinResult._M_dataplus._M_p,
                      CONCAT17(joinResult.field_2._M_local_buf[7],
                               CONCAT16(joinResult.field_2._M_local_buf[6],
                                        CONCAT15(joinResult.field_2._M_local_buf[5],
                                                 CONCAT14(joinResult.field_2._M_local_buf[4],
                                                          CONCAT13(joinResult.field_2._M_local_buf
                                                                   [3],CONCAT12(joinResult.field_2.
                                                                                _M_local_buf[2],
                                                                                joinResult.field_2.
                                                                                                                                                                
                                                  _M_allocated_capacity._0_2_)))))) + 1);
    }
    local_509 = local_509 & bVar6;
    pcVar56 = *(char **)((long)toUnixPaths[0] + lVar58);
    lVar58 = lVar58 + 0x10;
  } while (lVar58 != 0x100);
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  output.field_2._M_local_buf[0] = '\0';
  bVar6 = cmsys::SystemTools::GetEnv("HOME",&output);
  if (bVar6) {
    std::__cxx11::string::append((char *)&output);
    joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&joinResult,"~/foo bar/lala","");
    bVar6 = CheckConvertToUnixSlashes(&joinResult,&output);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
      operator_delete(joinResult._M_dataplus._M_p,
                      CONCAT17(joinResult.field_2._M_local_buf[7],
                               CONCAT16(joinResult.field_2._M_local_buf[6],
                                        CONCAT15(joinResult.field_2._M_local_buf[5],
                                                 CONCAT14(joinResult.field_2._M_local_buf[4],
                                                          CONCAT13(joinResult.field_2._M_local_buf
                                                                   [3],CONCAT12(joinResult.field_2.
                                                                                _M_local_buf[2],
                                                                                joinResult.field_2.
                                                                                                                                                                
                                                  _M_allocated_capacity._0_2_)))))) + 1);
    }
    local_509 = local_509 & bVar6;
  }
  pcVar56 = "1 foo 2 bar 2";
  lVar58 = 0;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test,pcVar56,(allocator<char> *)&originalPaths);
    poVar40 = *(ostream **)((long)checkEscapeChars[0] + lVar58 + 8);
    cVar1 = **(char **)((long)checkEscapeChars[0] + lVar58 + 0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&__dnew_1,*(char **)((long)checkEscapeChars[0] + lVar58 + 0x18),
               (allocator<char> *)&lines);
    cmsys::SystemTools::EscapeChars_abi_cxx11_
              (&joinResult,(SystemTools *)test._M_dataplus._M_p,(char *)poVar40,
               (char *)(ulong)(uint)(int)cVar1,(char)in_R8);
    bVar6 = true;
    if ((pointer)joinResult._M_string_length == local_500) {
      if (joinResult._M_string_length == 0) {
        bVar6 = false;
      }
      else {
        iVar39 = bcmp(joinResult._M_dataplus._M_p,(void *)__dnew_1,joinResult._M_string_length);
        bVar6 = iVar39 != 0;
      }
    }
    if (bVar6 != false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Problem with CheckEscapeChars - input: ",0x27);
      poVar40 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,test._M_dataplus._M_p,test._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar40," output: ",9);
      poVar40 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar40,joinResult._M_dataplus._M_p,joinResult._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar40," expected: ",0xb);
      poVar40 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar40,(char *)__dnew_1,(long)local_500);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar40 + -0x18) + (char)poVar40);
      std::ostream::put((char)poVar40);
      std::ostream::flush();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
      operator_delete(joinResult._M_dataplus._M_p,
                      CONCAT17(joinResult.field_2._M_local_buf[7],
                               CONCAT16(joinResult.field_2._M_local_buf[6],
                                        CONCAT15(joinResult.field_2._M_local_buf[5],
                                                 CONCAT14(joinResult.field_2._M_local_buf[4],
                                                          CONCAT13(joinResult.field_2._M_local_buf
                                                                   [3],CONCAT12(joinResult.field_2.
                                                                                _M_local_buf[2],
                                                                                joinResult.field_2.
                                                                                                                                                                
                                                  _M_allocated_capacity._0_2_)))))) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__dnew_1 != &local_4f8) {
      operator_delete((void *)__dnew_1,
                      CONCAT26(local_4f8._M_allocated_capacity._6_2_,
                               CONCAT24(local_4f8._M_allocated_capacity._4_2_,
                                        CONCAT22(local_4f8._M_allocated_capacity._2_2_,
                                                 CONCAT11(local_4f8._M_local_buf[1],
                                                          local_4f8._M_local_buf[0])))) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)test._M_dataplus._M_p != &test.field_2) {
      operator_delete(test._M_dataplus._M_p,
                      CONCAT17(test.field_2._M_local_buf[7],
                               CONCAT16(test.field_2._M_local_buf[6],
                                        CONCAT15(test.field_2._M_local_buf[5],
                                                 CONCAT14(test.field_2._M_local_buf[4],
                                                          CONCAT13(test.field_2._M_local_buf[3],
                                                                   CONCAT12(test.field_2.
                                                                            _M_local_buf[2],
                                                                            CONCAT11(test.field_2.
                                                                                     _M_local_buf[1]
                                                                                     ,test.field_2.
                                                                                      _M_local_buf
                                                                                      [0]))))))) + 1
                     );
    }
    local_509 = local_509 & (bVar6 ^ 1U);
    pcVar56 = *(char **)((long)checkEscapeChars[1] + lVar58);
    lVar58 = lVar58 + 0x20;
  } while (lVar58 != 0x40);
  bVar6 = CheckFileOperations();
  test._M_dataplus._M_p = (pointer)&test.field_2;
  joinResult._M_dataplus._M_p = (pointer)0x17;
  test._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&test,(ulong)&joinResult);
  test.field_2._M_local_buf[0] = (char)joinResult._M_dataplus._M_p;
  test.field_2._M_local_buf[1] = (char)((ulong)joinResult._M_dataplus._M_p >> 8);
  test.field_2._M_local_buf[2] = (char)((ulong)joinResult._M_dataplus._M_p >> 0x10);
  test.field_2._M_local_buf[3] = (char)((ulong)joinResult._M_dataplus._M_p >> 0x18);
  test.field_2._M_local_buf[4] = (char)((ulong)joinResult._M_dataplus._M_p >> 0x20);
  test.field_2._M_local_buf[5] = (char)((ulong)joinResult._M_dataplus._M_p >> 0x28);
  test.field_2._M_local_buf[6] = (char)((ulong)joinResult._M_dataplus._M_p >> 0x30);
  test.field_2._M_local_buf[7] = (char)((ulong)joinResult._M_dataplus._M_p >> 0x38);
  builtin_strncpy(test._M_dataplus._M_p,"mary had a little lamb.",0x17);
  test._M_string_length = (size_type)joinResult._M_dataplus._M_p;
  test._M_dataplus._M_p[(long)joinResult._M_dataplus._M_p] = '\0';
  cmsys::SystemTools::CapitalizedWords(&joinResult,&test);
  iVar39 = std::__cxx11::string::compare((char *)&joinResult);
  uVar53 = (undefined4)CONCAT71((int7)((ulong)poVar40 >> 8),iVar39 == 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  if (iVar39 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with CapitalizedWords ",0x1e);
    joinResult._M_dataplus._M_p._0_1_ = 0x22;
    poVar40 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&joinResult,1);
    poVar40 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar40,test._M_dataplus._M_p,test._M_string_length);
    joinResult._M_dataplus._M_p._0_1_ = 0x22;
    poVar40 = std::__ostream_insert<char,std::char_traits<char>>(poVar40,(char *)&joinResult,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar40 + -0x18) + (char)poVar40);
    std::ostream::put((char)poVar40);
    std::ostream::flush();
  }
  std::__cxx11::string::_M_replace((ulong)&test,0,(char *)test._M_string_length,0x12ee5f);
  cmsys::SystemTools::UnCapitalizedWords(&joinResult,&test);
  iVar39 = std::__cxx11::string::compare((char *)&joinResult);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  if (iVar39 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with UnCapitalizedWords ",0x20);
    joinResult._M_dataplus._M_p._0_1_ = 0x22;
    poVar40 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&joinResult,1);
    poVar40 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar40,test._M_dataplus._M_p,test._M_string_length);
    joinResult._M_dataplus._M_p._0_1_ = 0x22;
    poVar40 = std::__ostream_insert<char,std::char_traits<char>>(poVar40,(char *)&joinResult,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar40 + -0x18) + (char)poVar40);
    std::ostream::put((char)poVar40);
    std::ostream::flush();
    uVar53 = 0;
  }
  std::__cxx11::string::_M_replace((ulong)&test,0,(char *)test._M_string_length,0x12eeb7);
  cmsys::SystemTools::AddSpaceBetweenCapitalizedWords(&joinResult,&test);
  iVar39 = std::__cxx11::string::compare((char *)&joinResult);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  if (iVar39 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with AddSpaceBetweenCapitalizedWords ",0x2d);
    joinResult._M_dataplus._M_p._0_1_ = 0x22;
    poVar40 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&joinResult,1);
    poVar40 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar40,test._M_dataplus._M_p,test._M_string_length);
    joinResult._M_dataplus._M_p._0_1_ = 0x22;
    poVar40 = std::__ostream_insert<char,std::char_traits<char>>(poVar40,(char *)&joinResult,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar40 + -0x18) + (char)poVar40);
    std::ostream::put((char)poVar40);
    std::ostream::flush();
    uVar53 = 0;
  }
  pcVar56 = cmsys::SystemTools::AppendStrings("Mary Had A"," Little Lamb.");
  iVar39 = strcmp(pcVar56,"Mary Had A Little Lamb.");
  if (iVar39 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with AppendStrings ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\"Mary Had A\" \" Little Lamb.\"",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    uVar53 = 0;
  }
  if (pcVar56 != (char *)0x0) {
    operator_delete__(pcVar56);
  }
  pcVar56 = cmsys::SystemTools::AppendStrings("Mary Had"," A ","Little Lamb.");
  iVar39 = strcmp(pcVar56,"Mary Had A Little Lamb.");
  if (iVar39 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with AppendStrings ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\"Mary Had\" \" A \" \"Little Lamb.\"",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    uVar53 = 0;
  }
  if (pcVar56 != (char *)0x0) {
    operator_delete__(pcVar56);
  }
  sVar41 = cmsys::SystemTools::CountChar("Mary Had A Little Lamb.",'a');
  if (sVar41 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with CountChar ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\"Mary Had A Little Lamb.\"",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    uVar53 = 0;
  }
  pcVar56 = cmsys::SystemTools::RemoveChars("Mary Had A Little Lamb.","aeiou");
  iVar39 = strcmp(pcVar56,"Mry Hd A Lttl Lmb.");
  if (iVar39 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with RemoveChars ",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\"Mary Had A Little Lamb.\"",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    uVar53 = 0;
  }
  if (pcVar56 != (char *)0x0) {
    operator_delete__(pcVar56);
  }
  pcVar56 = cmsys::SystemTools::RemoveCharsButUpperHex("Mary Had A Little Lamb.");
  iVar39 = strcmp(pcVar56,"A");
  if (iVar39 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with RemoveCharsButUpperHex ",0x24);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\"Mary Had A Little Lamb.\"",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    uVar53 = 0;
  }
  if (pcVar56 != (char *)0x0) {
    operator_delete__(pcVar56);
  }
  pcVar56 = strdup("Mary Had A Little Lamb.");
  cmsys::SystemTools::ReplaceChars(pcVar56,"aeiou",'X');
  iVar39 = strcmp(pcVar56,"MXry HXd A LXttlX LXmb.");
  if (iVar39 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with ReplaceChars ",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\"Mary Had A Little Lamb.\"",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    uVar53 = 0;
  }
  free(pcVar56);
  bVar7 = cmsys::SystemTools::StringStartsWith("Mary Had A Little Lamb.","Mary ");
  if (!bVar7) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with StringStartsWith ",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\"Mary Had A Little Lamb.\"",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    uVar53 = 0;
  }
  bVar7 = cmsys::SystemTools::StringEndsWith("Mary Had A Little Lamb."," Lamb.");
  if (!bVar7) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with StringEndsWith ",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\"Mary Had A Little Lamb.\"",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    uVar53 = 0;
  }
  pcVar56 = cmsys::SystemTools::DuplicateString("Mary Had A Little Lamb.");
  iVar39 = strcmp(pcVar56,"Mary Had A Little Lamb.");
  if (iVar39 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with DuplicateString ",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\"Mary Had A Little Lamb.\"",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    uVar53 = 0;
  }
  if (pcVar56 != (char *)0x0) {
    operator_delete__(pcVar56);
  }
  std::__cxx11::string::_M_replace((ulong)&test,0,(char *)test._M_string_length,0x12ee5f);
  cmsys::SystemTools::CropString(&joinResult,&test,0xd);
  iVar39 = std::__cxx11::string::compare((char *)&joinResult);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  if (iVar39 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with CropString ",0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\"Mary Had A Little Lamb.\"",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    uVar53 = 0;
  }
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  __dnew_1 = 0x17;
  joinResult._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&joinResult,(ulong)&__dnew_1);
  joinResult.field_2._M_allocated_capacity._0_2_ = (undefined2)__dnew_1;
  joinResult.field_2._M_local_buf[2] = (char)(__dnew_1 >> 0x10);
  joinResult.field_2._M_local_buf[3] = (char)(__dnew_1 >> 0x18);
  joinResult.field_2._M_local_buf[4] = (char)(__dnew_1 >> 0x20);
  joinResult.field_2._M_local_buf[5] = (char)(__dnew_1 >> 0x28);
  joinResult.field_2._M_local_buf[6] = (char)(__dnew_1 >> 0x30);
  joinResult.field_2._M_local_buf[7] = (char)(__dnew_1 >> 0x38);
  builtin_strncpy(joinResult._M_dataplus._M_p,"Mary Had A Little Lamb.",0x17);
  joinResult._M_string_length = __dnew_1;
  joinResult._M_dataplus._M_p[__dnew_1] = '\0';
  cmsys::SystemTools::Split(&joinResult,&lines,' ');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  iVar39 = std::__cxx11::string::compare
                     ((char *)lines.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
  if ((((iVar39 != 0) ||
       (iVar39 = std::__cxx11::string::compare
                           ((char *)(lines.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 1)), iVar39 != 0))
      || (iVar39 = std::__cxx11::string::compare
                             ((char *)(lines.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 2)), iVar39 != 0)
      ) || ((iVar39 = std::__cxx11::string::compare
                                ((char *)(lines.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 3)),
            iVar39 != 0 ||
            (iVar39 = std::__cxx11::string::compare
                                ((char *)(lines.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 4)),
            iVar39 != 0)))) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with Split ",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\"Mary Had A Little Lamb.\"",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    uVar53 = 0;
  }
  local_410 = local_400;
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  joinResult.field_2._M_allocated_capacity._0_2_ = 0x614d;
  joinResult.field_2._M_local_buf[2] = 'r';
  joinResult.field_2._M_local_buf[3] = 'y';
  joinResult._M_string_length = 4;
  joinResult.field_2._M_local_buf[4] = '\0';
  local_400[0] = 0x646148;
  local_408 = 3;
  local_3f0 = local_3e0;
  local_3e0[0] = 0x41;
  local_3e8 = 1;
  local_3d0 = &local_3c0;
  local_3c0 = 0x7474694c;
  uStack_3bc = 0x656c;
  local_3c8 = 6;
  uStack_3ba = 0;
  plVar42 = &local_3a0;
  local_3a0._0_4_ = 0x626d614c;
  local_3a0._4_1_ = 0x2e;
  local_3b0[1] = (long *)0x5;
  local_3a0._5_1_ = 0;
  __l._M_len = 5;
  __l._M_array = &joinResult;
  local_3b0[0] = plVar42;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&linesToJoin,__l,(allocator_type *)&__dnew_1);
  lVar58 = -0xa0;
  do {
    if (plVar42 != (long *)plVar42[-2]) {
      operator_delete((long *)plVar42[-2],*plVar42 + 1);
    }
    plVar42 = plVar42 + -4;
    lVar58 = lVar58 + 0x20;
  } while (lVar58 != 0);
  local_4f8._M_local_buf[0] = ' ';
  local_4f8._M_local_buf[1] = '\0';
  local_500 = (pointer)0x1;
  __dnew_1 = (size_type)&local_4f8;
  cmsys::SystemTools::Join(&joinResult,&linesToJoin,(string *)&__dnew_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__dnew_1 != &local_4f8) {
    operator_delete((void *)__dnew_1,
                    CONCAT26(local_4f8._M_allocated_capacity._6_2_,
                             CONCAT24(local_4f8._M_allocated_capacity._4_2_,
                                      CONCAT22(local_4f8._M_allocated_capacity._2_2_,
                                               CONCAT11(local_4f8._M_local_buf[1],
                                                        local_4f8._M_local_buf[0])))) + 1);
  }
  iVar39 = std::__cxx11::string::compare((char *)&joinResult);
  if (iVar39 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with Join \"Mary Had A Little Lamb.\"",0x2b);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    uVar53 = 0;
  }
  originalPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&originalPaths.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __dnew_2 = 0x29;
  originalPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)std::__cxx11::string::_M_create((ulong *)&originalPaths,(ulong)&__dnew_2);
  originalPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)__dnew_2;
  builtin_strncpy((char *)((long)&(originalPaths.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->field_2 + 9),
                  "Pack/Iff",8);
  builtin_strncpy((char *)((long)&originalPaths.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p + 1)
                  ,"y Voodoo",8);
  ((originalPaths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->field_2)._M_allocated_capacity = 0x7265776f50207865;
  builtin_strncpy((char *)((long)&(originalPaths.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->field_2 + 8),
                  " Pack/If",8);
  ((originalPaths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p = (pointer)0x61636f4c2f2f3a4c;
  (originalPaths.
   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
   ._M_impl.super__Vector_impl_data._M_start)->_M_string_length = 0x482f6f6a6f4d206c;
  originalPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)__dnew_2;
  *(undefined1 *)
   ((long)&((originalPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + __dnew_2) = 0;
  cmsys::SystemTools::ConvertToWindowsOutputPath((string *)&__dnew_1,(string *)&originalPaths);
  iVar39 = std::__cxx11::string::compare((char *)&__dnew_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__dnew_1 != &local_4f8) {
    operator_delete((void *)__dnew_1,
                    CONCAT26(local_4f8._M_allocated_capacity._6_2_,
                             CONCAT24(local_4f8._M_allocated_capacity._4_2_,
                                      CONCAT22(local_4f8._M_allocated_capacity._2_2_,
                                               CONCAT11(local_4f8._M_local_buf[1],
                                                        local_4f8._M_local_buf[0])))) + 1);
  }
  if (originalPaths.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&originalPaths.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(originalPaths.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((originalPaths.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (iVar39 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with ConvertToWindowsOutputPath ",0x28);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\"L://Local Mojo/Hex Power Pack/Iffy Voodoo\"",0x2b);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    uVar53 = 0;
  }
  originalPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&originalPaths.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __dnew_2 = 0x2f;
  originalPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)std::__cxx11::string::_M_create((ulong *)&originalPaths,(ulong)&__dnew_2);
  originalPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)__dnew_2;
  builtin_strncpy((char *)((long)&(originalPaths.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->field_2 + 0xf),
                  "Pack/Iff",8);
  builtin_strncpy((char *)((long)&originalPaths.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p + 7)
                  ,"y Voodoo",8);
  ((originalPaths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->field_2)._M_allocated_capacity = 0x7865482f6f6a6f4d;
  builtin_strncpy((char *)((long)&(originalPaths.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->field_2 + 8),
                  " Power P",8);
  ((originalPaths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p = (pointer)0x6f73796172672f2f;
  (originalPaths.
   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
   ._M_impl.super__Vector_impl_data._M_start)->_M_string_length = 0x206c61636f4c2f6e;
  originalPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)__dnew_2;
  *(undefined1 *)
   ((long)&((originalPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + __dnew_2) = 0;
  cmsys::SystemTools::ConvertToWindowsOutputPath((string *)&__dnew_1,(string *)&originalPaths);
  iVar39 = std::__cxx11::string::compare((char *)&__dnew_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__dnew_1 != &local_4f8) {
    operator_delete((void *)__dnew_1,
                    CONCAT26(local_4f8._M_allocated_capacity._6_2_,
                             CONCAT24(local_4f8._M_allocated_capacity._4_2_,
                                      CONCAT22(local_4f8._M_allocated_capacity._2_2_,
                                               CONCAT11(local_4f8._M_local_buf[1],
                                                        local_4f8._M_local_buf[0])))) + 1);
  }
  if (originalPaths.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&originalPaths.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(originalPaths.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((originalPaths.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (iVar39 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with ConvertToWindowsOutputPath ",0x28);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\"//grayson/Local Mojo/Hex Power Pack/Iffy Voodoo\"",0x31);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    uVar53 = 0;
  }
  originalPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&originalPaths.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __dnew_2 = 0x27;
  originalPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)std::__cxx11::string::_M_create((ulong *)&originalPaths,(ulong)&__dnew_2);
  originalPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)__dnew_2;
  ((originalPaths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->field_2)._M_allocated_capacity = 0x50207265776f5020;
  builtin_strncpy((char *)((long)&(originalPaths.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->field_2 + 8),
                  "ack/Iffy",8);
  ((originalPaths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p = (pointer)0x206c61636f4c2f2f;
  (originalPaths.
   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
   ._M_impl.super__Vector_impl_data._M_start)->_M_string_length = 0x7865482f6f6a6f4d;
  *(undefined8 *)
   ((long)&(originalPaths.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->field_2 + 0xf) = 0x6f6f646f6f562079;
  originalPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)__dnew_2;
  *(undefined1 *)
   ((long)&((originalPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + __dnew_2) = 0;
  cmsys::SystemTools::ConvertToUnixOutputPath((string *)&__dnew_1,(string *)&originalPaths);
  iVar39 = std::__cxx11::string::compare((char *)&__dnew_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__dnew_1 != &local_4f8) {
    operator_delete((void *)__dnew_1,
                    CONCAT26(local_4f8._M_allocated_capacity._6_2_,
                             CONCAT24(local_4f8._M_allocated_capacity._4_2_,
                                      CONCAT22(local_4f8._M_allocated_capacity._2_2_,
                                               CONCAT11(local_4f8._M_local_buf[1],
                                                        local_4f8._M_local_buf[0])))) + 1);
  }
  if (originalPaths.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&originalPaths.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(originalPaths.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((originalPaths.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (iVar39 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with ConvertToUnixOutputPath ",0x25);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\"//Local Mojo/Hex Power Pack/Iffy Voodoo\"",0x29);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    uVar53 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&linesToJoin);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&lines);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  joinResult.field_2._M_allocated_capacity._0_2_ = 0x3d41;
  joinResult.field_2._M_local_buf[2] = 'B';
  joinResult.field_2._M_local_buf[3] = '\0';
  joinResult._M_string_length = 3;
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  bVar7 = CheckPutEnv(&joinResult,"A","B");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  joinResult.field_2._M_allocated_capacity._0_2_ = 0x3d42;
  joinResult.field_2._M_local_buf[2] = 'C';
  joinResult.field_2._M_local_buf[3] = '\0';
  joinResult._M_string_length = 3;
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  bVar8 = CheckPutEnv(&joinResult,"B","C");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  joinResult.field_2._M_allocated_capacity._0_2_ = 0x3d43;
  joinResult.field_2._M_local_buf[2] = 'D';
  joinResult.field_2._M_local_buf[3] = '\0';
  joinResult._M_string_length = 3;
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  bVar9 = CheckPutEnv(&joinResult,"C","D");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  joinResult.field_2._M_allocated_capacity._0_2_ = 0x3d44;
  joinResult.field_2._M_local_buf[2] = 'E';
  joinResult.field_2._M_local_buf[3] = '\0';
  joinResult._M_string_length = 3;
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  bVar10 = CheckPutEnv(&joinResult,"D","E");
  local_64 = uVar53;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  bVar11 = CheckUnPutEnv("A","A");
  bVar12 = CheckUnPutEnv("B=","B");
  bVar13 = CheckUnPutEnv("C=D","C");
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  joinResult.field_2._M_allocated_capacity._0_2_ = 29999;
  joinResult.field_2._M_local_buf[2] = 's';
  joinResult.field_2._M_local_buf[3] = 'r';
  joinResult.field_2._M_local_buf[4] = '/';
  joinResult.field_2._M_local_buf[5] = 's';
  joinResult.field_2._M_local_buf[6] = 'h';
  joinResult.field_2._M_local_buf[7] = 'a';
  joinResult.field_2._M_local_buf[8] = 'r';
  joinResult.field_2._M_local_buf[9] = 'e';
  joinResult._M_string_length = 10;
  joinResult.field_2._M_local_buf[10] = '\0';
  test._M_dataplus._M_p = (pointer)&test.field_2;
  test.field_2._M_local_buf[0] = '/';
  test.field_2._M_local_buf[1] = 'b';
  test.field_2._M_local_buf[2] = 'i';
  test.field_2._M_local_buf[3] = 'n';
  test.field_2._M_local_buf[4] = '/';
  test.field_2._M_local_buf[5] = 'b';
  test.field_2._M_local_buf[6] = 'a';
  test.field_2._M_local_buf[7] = 's';
  test.field_2._M_local_buf[8] = 'h';
  test.field_2._M_local_buf[9] = '\0';
  test._M_string_length = 9;
  local_4f8._M_local_buf[0] = '.';
  local_4f8._M_local_buf[1] = '.';
  local_4f8._M_allocated_capacity._2_2_ = 0x2e2f;
  local_4f8._M_allocated_capacity._4_2_ = 0x2f2e;
  local_4f8._M_allocated_capacity._6_2_ = 0x6962;
  local_4f8._8_6_ = 0x687361622f6e;
  local_500 = (pointer)0xe;
  local_4f8._M_local_buf[0xe] = '\0';
  __dnew_1 = (size_type)&local_4f8;
  bVar14 = CheckRelativePath(&joinResult,&test,(string *)&__dnew_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__dnew_1 != &local_4f8) {
    operator_delete((void *)__dnew_1,
                    CONCAT26(local_4f8._M_allocated_capacity._6_2_,
                             CONCAT24(local_4f8._M_allocated_capacity._4_2_,
                                      CONCAT22(local_4f8._M_allocated_capacity._2_2_,
                                               CONCAT11(local_4f8._M_local_buf[1],
                                                        local_4f8._M_local_buf[0])))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  joinResult.field_2._M_allocated_capacity._0_2_ = 29999;
  joinResult.field_2._M_local_buf[2] = 's';
  joinResult.field_2._M_local_buf[3] = 'r';
  joinResult.field_2._M_local_buf[4] = '/';
  joinResult.field_2._M_local_buf[5] = '.';
  joinResult.field_2._M_local_buf[6] = '/';
  joinResult.field_2._M_local_buf[7] = 's';
  joinResult.field_2._M_local_buf[8] = 'h';
  joinResult.field_2._M_local_buf[9] = 'a';
  joinResult.field_2._M_local_buf[10] = 'r';
  joinResult.field_2._M_local_buf[0xb] = 'e';
  joinResult.field_2._M_local_buf[0xc] = '/';
  joinResult._M_string_length = 0xd;
  joinResult.field_2._M_local_buf[0xd] = '\0';
  test._M_dataplus._M_p = (pointer)&test.field_2;
  test.field_2._M_local_buf[0] = '/';
  test.field_2._M_local_buf[1] = 'b';
  test.field_2._M_local_buf[2] = 'i';
  test.field_2._M_local_buf[3] = 'n';
  test.field_2._M_local_buf[4] = '/';
  test.field_2._M_local_buf[5] = 'b';
  test.field_2._M_local_buf[6] = 'a';
  test.field_2._M_local_buf[7] = 's';
  test.field_2._M_local_buf[8] = 'h';
  test.field_2._M_local_buf[9] = '\0';
  test._M_string_length = 9;
  local_4f8._M_local_buf[0] = '.';
  local_4f8._M_local_buf[1] = '.';
  local_4f8._M_allocated_capacity._2_2_ = 0x2e2f;
  local_4f8._M_allocated_capacity._4_2_ = 0x2f2e;
  local_4f8._M_allocated_capacity._6_2_ = 0x6962;
  local_4f8._8_6_ = 0x687361622f6e;
  local_500 = (pointer)0xe;
  local_4f8._M_local_buf[0xe] = '\0';
  __dnew_1 = (size_type)&local_4f8;
  bVar15 = CheckRelativePath(&joinResult,&test,(string *)&__dnew_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__dnew_1 != &local_4f8) {
    operator_delete((void *)__dnew_1,
                    CONCAT26(local_4f8._M_allocated_capacity._6_2_,
                             CONCAT24(local_4f8._M_allocated_capacity._4_2_,
                                      CONCAT22(local_4f8._M_allocated_capacity._2_2_,
                                               CONCAT11(local_4f8._M_local_buf[1],
                                                        local_4f8._M_local_buf[0])))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  joinResult.field_2._M_allocated_capacity._0_2_ = 29999;
  joinResult.field_2._M_local_buf[2] = 's';
  joinResult.field_2._M_local_buf[3] = 'r';
  joinResult.field_2._M_local_buf[4] = '/';
  joinResult.field_2._M_local_buf[5] = '/';
  joinResult.field_2._M_local_buf[6] = 's';
  joinResult.field_2._M_local_buf[7] = 'h';
  joinResult.field_2._M_local_buf[8] = 'a';
  joinResult.field_2._M_local_buf[9] = 'r';
  joinResult.field_2._M_local_buf[10] = 'e';
  joinResult.field_2._M_local_buf[0xb] = '/';
  joinResult._M_string_length = 0xc;
  joinResult.field_2._M_local_buf[0xc] = '\0';
  test._M_dataplus._M_p = (pointer)&test.field_2;
  test.field_2._M_local_buf[0] = '/';
  test.field_2._M_local_buf[1] = 'b';
  test.field_2._M_local_buf[2] = 'i';
  test.field_2._M_local_buf[3] = 'n';
  test.field_2._M_local_buf[4] = '/';
  test.field_2._M_local_buf[5] = 'b';
  test.field_2._M_local_buf[6] = 'a';
  test.field_2._M_local_buf[7] = 's';
  test.field_2._M_local_buf[8] = 'h';
  test.field_2._M_local_buf[9] = '\0';
  test._M_string_length = 9;
  local_4f8._M_local_buf[0] = '.';
  local_4f8._M_local_buf[1] = '.';
  local_4f8._M_allocated_capacity._2_2_ = 0x2e2f;
  local_4f8._M_allocated_capacity._4_2_ = 0x2f2e;
  local_4f8._M_allocated_capacity._6_2_ = 0x6962;
  local_4f8._8_6_ = 0x687361622f6e;
  local_500 = (pointer)0xe;
  local_4f8._M_local_buf[0xe] = '\0';
  __dnew_1 = (size_type)&local_4f8;
  bVar16 = CheckRelativePath(&joinResult,&test,(string *)&__dnew_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__dnew_1 != &local_4f8) {
    operator_delete((void *)__dnew_1,
                    CONCAT26(local_4f8._M_allocated_capacity._6_2_,
                             CONCAT24(local_4f8._M_allocated_capacity._4_2_,
                                      CONCAT22(local_4f8._M_allocated_capacity._2_2_,
                                               CONCAT11(local_4f8._M_local_buf[1],
                                                        local_4f8._M_local_buf[0])))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  test._M_dataplus._M_p = (pointer)0x12;
  joinResult._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&joinResult,(ulong)&test);
  joinResult.field_2._M_allocated_capacity._0_2_ = SUB82(test._M_dataplus._M_p,0);
  joinResult.field_2._M_local_buf[2] = (char)((ulong)test._M_dataplus._M_p >> 0x10);
  joinResult.field_2._M_local_buf[3] = (char)((ulong)test._M_dataplus._M_p >> 0x18);
  joinResult.field_2._M_local_buf[4] = (char)((ulong)test._M_dataplus._M_p >> 0x20);
  joinResult.field_2._M_local_buf[5] = (char)((ulong)test._M_dataplus._M_p >> 0x28);
  joinResult.field_2._M_local_buf[6] = (char)((ulong)test._M_dataplus._M_p >> 0x30);
  joinResult.field_2._M_local_buf[7] = (char)((ulong)test._M_dataplus._M_p >> 0x38);
  builtin_strncpy(joinResult._M_dataplus._M_p,"/usr/share/../bin/",0x12);
  joinResult._M_string_length = (size_type)test._M_dataplus._M_p;
  joinResult._M_dataplus._M_p[(long)test._M_dataplus._M_p] = '\0';
  test._M_dataplus._M_p = (pointer)&test.field_2;
  test.field_2._M_local_buf[0] = '/';
  test.field_2._M_local_buf[1] = 'b';
  test.field_2._M_local_buf[2] = 'i';
  test.field_2._M_local_buf[3] = 'n';
  test.field_2._M_local_buf[4] = '/';
  test.field_2._M_local_buf[5] = 'b';
  test.field_2._M_local_buf[6] = 'a';
  test.field_2._M_local_buf[7] = 's';
  test.field_2._M_local_buf[8] = 'h';
  test.field_2._M_local_buf[9] = '\0';
  test._M_string_length = 9;
  local_4f8._M_local_buf[0] = '.';
  local_4f8._M_local_buf[1] = '.';
  local_4f8._M_allocated_capacity._2_2_ = 0x2e2f;
  local_4f8._M_allocated_capacity._4_2_ = 0x2f2e;
  local_4f8._M_allocated_capacity._6_2_ = 0x6962;
  local_4f8._8_6_ = 0x687361622f6e;
  local_500 = (pointer)0xe;
  local_4f8._M_local_buf[0xe] = '\0';
  __dnew_1 = (size_type)&local_4f8;
  bVar17 = CheckRelativePath(&joinResult,&test,(string *)&__dnew_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__dnew_1 != &local_4f8) {
    operator_delete((void *)__dnew_1,
                    CONCAT26(local_4f8._M_allocated_capacity._6_2_,
                             CONCAT24(local_4f8._M_allocated_capacity._4_2_,
                                      CONCAT22(local_4f8._M_allocated_capacity._2_2_,
                                               CONCAT11(local_4f8._M_local_buf[1],
                                                        local_4f8._M_local_buf[0])))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  joinResult.field_2._M_allocated_capacity._0_2_ = 29999;
  joinResult.field_2._M_local_buf[2] = 's';
  joinResult.field_2._M_local_buf[3] = 'r';
  joinResult.field_2._M_local_buf[4] = '/';
  joinResult.field_2._M_local_buf[5] = 's';
  joinResult.field_2._M_local_buf[6] = 'h';
  joinResult.field_2._M_local_buf[7] = 'a';
  joinResult.field_2._M_local_buf[8] = 'r';
  joinResult.field_2._M_local_buf[9] = 'e';
  joinResult._M_string_length = 10;
  joinResult.field_2._M_local_buf[10] = '\0';
  test._M_dataplus._M_p = (pointer)&test.field_2;
  test.field_2._M_local_buf[0] = '/';
  test.field_2._M_local_buf[1] = 'u';
  test.field_2._M_local_buf[2] = 's';
  test.field_2._M_local_buf[3] = 'r';
  test.field_2._M_local_buf[4] = '/';
  test.field_2._M_local_buf[5] = 's';
  test.field_2._M_local_buf[6] = 'h';
  test.field_2._M_local_buf[7] = 'a';
  test.field_2._M_local_buf[8] = 'r';
  test.field_2._M_local_buf[9] = 'e';
  test.field_2._10_2_ = 0x2f2f;
  test.field_2._M_local_buf[0xc] = 'b';
  test.field_2._M_local_buf[0xd] = 'i';
  test.field_2._M_local_buf[0xe] = 'n';
  test._M_string_length = 0xf;
  test.field_2._M_local_buf[0xf] = '\0';
  local_4f8._M_local_buf[0] = 'b';
  local_4f8._M_local_buf[1] = 'i';
  local_4f8._M_allocated_capacity._2_2_ = 0x6e;
  local_500 = (pointer)0x3;
  __dnew_1 = (size_type)&local_4f8;
  bVar18 = CheckRelativePath(&joinResult,&test,(string *)&__dnew_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__dnew_1 != &local_4f8) {
    operator_delete((void *)__dnew_1,
                    CONCAT26(local_4f8._M_allocated_capacity._6_2_,
                             CONCAT24(local_4f8._M_allocated_capacity._4_2_,
                                      CONCAT22(local_4f8._M_allocated_capacity._2_2_,
                                               CONCAT11(local_4f8._M_local_buf[1],
                                                        local_4f8._M_local_buf[0])))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  joinResult.field_2._M_allocated_capacity._0_2_ = 29999;
  joinResult.field_2._M_local_buf[2] = 's';
  joinResult.field_2._M_local_buf[3] = 'r';
  joinResult.field_2._M_local_buf[4] = '/';
  joinResult.field_2._M_local_buf[5] = 's';
  joinResult.field_2._M_local_buf[6] = 'h';
  joinResult.field_2._M_local_buf[7] = 'a';
  joinResult.field_2._M_local_buf[8] = 'r';
  joinResult.field_2._M_local_buf[9] = 'e';
  joinResult.field_2._M_local_buf[10] = '/';
  joinResult.field_2._M_local_buf[0xb] = '*';
  joinResult._M_string_length = 0xc;
  joinResult.field_2._M_local_buf[0xc] = '\0';
  test.field_2._M_local_buf[0] = '/';
  test.field_2._M_local_buf[1] = 'u';
  test.field_2._M_local_buf[2] = 's';
  test.field_2._M_local_buf[3] = 'r';
  test.field_2._M_local_buf[4] = '/';
  test.field_2._M_local_buf[5] = 's';
  test.field_2._M_local_buf[6] = 'h';
  test.field_2._M_local_buf[7] = 'a';
  test.field_2._M_local_buf[8] = 'r';
  test.field_2._M_local_buf[9] = 'e';
  test.field_2._10_2_ = 0x2a2f;
  test._M_string_length = 0xc;
  test.field_2._M_local_buf[0xc] = '\0';
  test._M_dataplus._M_p = (pointer)&test.field_2;
  bVar19 = CheckCollapsePath(&joinResult,&test,(char *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  joinResult.field_2._M_allocated_capacity._0_2_ = 0x3a43;
  joinResult.field_2._M_local_buf[2] = '/';
  joinResult.field_2._M_local_buf[3] = 'W';
  joinResult.field_2._M_local_buf[4] = 'i';
  joinResult.field_2._M_local_buf[5] = 'n';
  joinResult.field_2._M_local_buf[6] = 'd';
  joinResult.field_2._M_local_buf[7] = 'o';
  joinResult.field_2._M_local_buf[8] = 'w';
  joinResult.field_2._M_local_buf[9] = 's';
  joinResult.field_2._M_local_buf[10] = '/';
  joinResult.field_2._M_local_buf[0xb] = '*';
  joinResult._M_string_length = 0xc;
  joinResult.field_2._M_local_buf[0xc] = '\0';
  test.field_2._M_local_buf[0] = 'C';
  test.field_2._M_local_buf[1] = ':';
  test.field_2._M_local_buf[2] = '/';
  test.field_2._M_local_buf[3] = 'W';
  test.field_2._M_local_buf[4] = 'i';
  test.field_2._M_local_buf[5] = 'n';
  test.field_2._M_local_buf[6] = 'd';
  test.field_2._M_local_buf[7] = 'o';
  test.field_2._M_local_buf[8] = 'w';
  test.field_2._M_local_buf[9] = 's';
  test.field_2._10_2_ = 0x2a2f;
  test._M_string_length = 0xc;
  test.field_2._M_local_buf[0xc] = '\0';
  test._M_dataplus._M_p = (pointer)&test.field_2;
  bVar20 = CheckCollapsePath(&joinResult,&test,(char *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  test._M_dataplus._M_p = (pointer)0x11;
  joinResult._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&joinResult,(ulong)&test);
  joinResult.field_2._M_allocated_capacity._0_2_ = SUB82(test._M_dataplus._M_p,0);
  joinResult.field_2._M_local_buf[2] = (char)((ulong)test._M_dataplus._M_p >> 0x10);
  joinResult.field_2._M_local_buf[3] = (char)((ulong)test._M_dataplus._M_p >> 0x18);
  joinResult.field_2._M_local_buf[4] = (char)((ulong)test._M_dataplus._M_p >> 0x20);
  joinResult.field_2._M_local_buf[5] = (char)((ulong)test._M_dataplus._M_p >> 0x28);
  joinResult.field_2._M_local_buf[6] = (char)((ulong)test._M_dataplus._M_p >> 0x30);
  joinResult.field_2._M_local_buf[7] = (char)((ulong)test._M_dataplus._M_p >> 0x38);
  builtin_strncpy(joinResult._M_dataplus._M_p,"/usr/share/../lib",0x11);
  joinResult._M_string_length = (size_type)test._M_dataplus._M_p;
  joinResult._M_dataplus._M_p[(long)test._M_dataplus._M_p] = '\0';
  test.field_2._M_local_buf[0] = '/';
  test.field_2._M_local_buf[1] = 'u';
  test.field_2._M_local_buf[2] = 's';
  test.field_2._M_local_buf[3] = 'r';
  test.field_2._M_local_buf[4] = '/';
  test.field_2._M_local_buf[5] = 'l';
  test.field_2._M_local_buf[6] = 'i';
  test.field_2._M_local_buf[7] = 'b';
  test._M_string_length = 8;
  test.field_2._M_local_buf[8] = '\0';
  test._M_dataplus._M_p = (pointer)&test.field_2;
  bVar21 = CheckCollapsePath(&joinResult,&test,(char *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  test._M_dataplus._M_p = (pointer)0x10;
  joinResult._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&joinResult,(ulong)&test);
  joinResult.field_2._M_allocated_capacity._0_2_ = SUB82(test._M_dataplus._M_p,0);
  joinResult.field_2._M_local_buf[2] = (char)((ulong)test._M_dataplus._M_p >> 0x10);
  joinResult.field_2._M_local_buf[3] = (char)((ulong)test._M_dataplus._M_p >> 0x18);
  joinResult.field_2._M_local_buf[4] = (char)((ulong)test._M_dataplus._M_p >> 0x20);
  joinResult.field_2._M_local_buf[5] = (char)((ulong)test._M_dataplus._M_p >> 0x28);
  joinResult.field_2._M_local_buf[6] = (char)((ulong)test._M_dataplus._M_p >> 0x30);
  joinResult.field_2._M_local_buf[7] = (char)((ulong)test._M_dataplus._M_p >> 0x38);
  builtin_strncpy(joinResult._M_dataplus._M_p,"/usr/share/./lib",0x10);
  joinResult._M_string_length = (size_type)test._M_dataplus._M_p;
  joinResult._M_dataplus._M_p[(long)test._M_dataplus._M_p] = '\0';
  test.field_2._M_local_buf[0] = '/';
  test.field_2._M_local_buf[1] = 'u';
  test.field_2._M_local_buf[2] = 's';
  test.field_2._M_local_buf[3] = 'r';
  test.field_2._M_local_buf[4] = '/';
  test.field_2._M_local_buf[5] = 's';
  test.field_2._M_local_buf[6] = 'h';
  test.field_2._M_local_buf[7] = 'a';
  test.field_2._M_local_buf[8] = 'r';
  test.field_2._M_local_buf[9] = 'e';
  test.field_2._10_2_ = 0x6c2f;
  test.field_2._M_local_buf[0xc] = 'i';
  test.field_2._M_local_buf[0xd] = 'b';
  test._M_string_length = 0xe;
  test.field_2._M_local_buf[0xe] = '\0';
  test._M_dataplus._M_p = (pointer)&test.field_2;
  bVar22 = CheckCollapsePath(&joinResult,&test,(char *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  test._M_dataplus._M_p = (pointer)0x14;
  joinResult._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&joinResult,(ulong)&test);
  joinResult.field_2._M_allocated_capacity._0_2_ = SUB82(test._M_dataplus._M_p,0);
  joinResult.field_2._M_local_buf[2] = (char)((ulong)test._M_dataplus._M_p >> 0x10);
  joinResult.field_2._M_local_buf[3] = (char)((ulong)test._M_dataplus._M_p >> 0x18);
  joinResult.field_2._M_local_buf[4] = (char)((ulong)test._M_dataplus._M_p >> 0x20);
  joinResult.field_2._M_local_buf[5] = (char)((ulong)test._M_dataplus._M_p >> 0x28);
  joinResult.field_2._M_local_buf[6] = (char)((ulong)test._M_dataplus._M_p >> 0x30);
  joinResult.field_2._M_local_buf[7] = (char)((ulong)test._M_dataplus._M_p >> 0x38);
  builtin_strncpy(joinResult._M_dataplus._M_p,"/usr/share/../../lib",0x14);
  joinResult._M_string_length = (size_type)test._M_dataplus._M_p;
  joinResult._M_dataplus._M_p[(long)test._M_dataplus._M_p] = '\0';
  test.field_2._M_local_buf[0] = '/';
  test.field_2._M_local_buf[1] = 'l';
  test.field_2._M_local_buf[2] = 'i';
  test.field_2._M_local_buf[3] = 'b';
  test._M_string_length = 4;
  test.field_2._M_local_buf[4] = '\0';
  test._M_dataplus._M_p = (pointer)&test.field_2;
  bVar23 = CheckCollapsePath(&joinResult,&test,(char *)0x0);
  uVar55 = CONCAT71(extraout_var,bVar23) & 0xffffffff;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  test._M_dataplus._M_p = (pointer)0x16;
  joinResult._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&joinResult,(ulong)&test);
  joinResult.field_2._M_allocated_capacity._0_2_ = SUB82(test._M_dataplus._M_p,0);
  joinResult.field_2._M_local_buf[2] = (char)((ulong)test._M_dataplus._M_p >> 0x10);
  joinResult.field_2._M_local_buf[3] = (char)((ulong)test._M_dataplus._M_p >> 0x18);
  joinResult.field_2._M_local_buf[4] = (char)((ulong)test._M_dataplus._M_p >> 0x20);
  joinResult.field_2._M_local_buf[5] = (char)((ulong)test._M_dataplus._M_p >> 0x28);
  joinResult.field_2._M_local_buf[6] = (char)((ulong)test._M_dataplus._M_p >> 0x30);
  joinResult.field_2._M_local_buf[7] = (char)((ulong)test._M_dataplus._M_p >> 0x38);
  builtin_strncpy(joinResult._M_dataplus._M_p,"/usr/share/.././../lib",0x16);
  joinResult._M_string_length = (size_type)test._M_dataplus._M_p;
  joinResult._M_dataplus._M_p[(long)test._M_dataplus._M_p] = '\0';
  test.field_2._M_local_buf[0] = '/';
  test.field_2._M_local_buf[1] = 'l';
  test.field_2._M_local_buf[2] = 'i';
  test.field_2._M_local_buf[3] = 'b';
  test._M_string_length = 4;
  test.field_2._M_local_buf[4] = '\0';
  test._M_dataplus._M_p = (pointer)&test.field_2;
  bVar23 = CheckCollapsePath(&joinResult,&test,(char *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  joinResult.field_2._M_local_buf[4] = 'l';
  joinResult.field_2._M_local_buf[5] = 'i';
  joinResult.field_2._M_local_buf[6] = 'b';
  joinResult.field_2._M_allocated_capacity._0_2_ = 0x2e2f;
  joinResult.field_2._M_local_buf[2] = '.';
  joinResult.field_2._M_local_buf[3] = '/';
  joinResult._M_string_length = 7;
  joinResult.field_2._M_local_buf[7] = '\0';
  test.field_2._M_local_buf[0] = '/';
  test.field_2._M_local_buf[1] = 'l';
  test.field_2._M_local_buf[2] = 'i';
  test.field_2._M_local_buf[3] = 'b';
  test._M_string_length = 4;
  test.field_2._M_local_buf[4] = '\0';
  test._M_dataplus._M_p = (pointer)&test.field_2;
  bVar24 = CheckCollapsePath(&joinResult,&test,(char *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  joinResult.field_2._M_allocated_capacity._0_2_ = 0x2e2f;
  joinResult.field_2._M_local_buf[2] = '.';
  joinResult.field_2._M_local_buf[3] = '/';
  joinResult.field_2._M_local_buf[4] = 'l';
  joinResult.field_2._M_local_buf[5] = 'i';
  joinResult.field_2._M_local_buf[6] = 'b';
  joinResult.field_2._M_local_buf[7] = '/';
  joinResult._M_string_length = 8;
  joinResult.field_2._M_local_buf[8] = '\0';
  test.field_2._M_local_buf[0] = '/';
  test.field_2._M_local_buf[1] = 'l';
  test.field_2._M_local_buf[2] = 'i';
  test.field_2._M_local_buf[3] = 'b';
  test._M_string_length = 4;
  test.field_2._M_local_buf[4] = '\0';
  test._M_dataplus._M_p = (pointer)&test.field_2;
  bVar25 = CheckCollapsePath(&joinResult,&test,(char *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  joinResult.field_2._M_allocated_capacity._0_2_ = 0x2f;
  joinResult._M_string_length = 1;
  test.field_2._M_local_buf[0] = '/';
  test.field_2._M_local_buf[1] = '\0';
  test._M_string_length = 1;
  test._M_dataplus._M_p = (pointer)&test.field_2;
  bVar26 = CheckCollapsePath(&joinResult,&test,(char *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  joinResult.field_2._M_allocated_capacity._0_2_ = 0x3a43;
  joinResult.field_2._M_local_buf[2] = '/';
  joinResult.field_2._M_local_buf[3] = '\0';
  joinResult._M_string_length = 3;
  test.field_2._M_local_buf[0] = 'C';
  test.field_2._M_local_buf[1] = ':';
  test.field_2._M_local_buf[2] = '/';
  test.field_2._M_local_buf[3] = '\0';
  test._M_string_length = 3;
  test._M_dataplus._M_p = (pointer)&test.field_2;
  bVar27 = CheckCollapsePath(&joinResult,&test,(char *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  joinResult.field_2._M_allocated_capacity._0_2_ = 0x3a43;
  joinResult.field_2._M_local_buf[2] = '/';
  joinResult.field_2._M_local_buf[3] = '.';
  joinResult.field_2._M_local_buf[4] = '.';
  joinResult.field_2._M_local_buf[5] = '/';
  joinResult._M_string_length = 6;
  joinResult.field_2._M_local_buf[6] = '\0';
  test.field_2._M_local_buf[0] = 'C';
  test.field_2._M_local_buf[1] = ':';
  test.field_2._M_local_buf[2] = '/';
  test.field_2._M_local_buf[3] = '\0';
  test._M_string_length = 3;
  test._M_dataplus._M_p = (pointer)&test.field_2;
  bVar28 = CheckCollapsePath(&joinResult,&test,(char *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  joinResult.field_2._M_allocated_capacity._0_2_ = 0x3a43;
  joinResult.field_2._M_local_buf[2] = '/';
  joinResult.field_2._M_local_buf[3] = '.';
  joinResult.field_2._M_local_buf[4] = '.';
  joinResult.field_2._M_local_buf[5] = '/';
  joinResult.field_2._M_local_buf[6] = '.';
  joinResult.field_2._M_local_buf[7] = '.';
  joinResult.field_2._M_local_buf[8] = '/';
  joinResult.field_2._M_local_buf[9] = '\0';
  joinResult._M_string_length = 9;
  test.field_2._M_local_buf[0] = 'C';
  test.field_2._M_local_buf[1] = ':';
  test.field_2._M_local_buf[2] = '/';
  test.field_2._M_local_buf[3] = '\0';
  test._M_string_length = 3;
  test._M_dataplus._M_p = (pointer)&test.field_2;
  bVar29 = CheckCollapsePath(&joinResult,&test,(char *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  joinResult.field_2._M_allocated_capacity._0_2_ = 0x2e2e;
  joinResult.field_2._M_local_buf[2] = '/';
  joinResult.field_2._M_local_buf[3] = 'b';
  joinResult._M_string_length = 4;
  joinResult.field_2._M_local_buf[4] = '\0';
  test.field_2._M_local_buf[4] = '.';
  test.field_2._M_local_buf[5] = '/';
  test.field_2._M_local_buf[6] = 'b';
  test.field_2._M_local_buf[0] = '.';
  test.field_2._M_local_buf[1] = '.';
  test.field_2._M_local_buf[2] = '/';
  test.field_2._M_local_buf[3] = '.';
  test._M_string_length = 7;
  test.field_2._M_local_buf[7] = '\0';
  test._M_dataplus._M_p = (pointer)&test.field_2;
  bVar30 = CheckCollapsePath(&joinResult,&test,"../");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  joinResult.field_2._M_allocated_capacity._0_2_ = 0x2e2e;
  joinResult.field_2._M_local_buf[2] = '/';
  joinResult.field_2._M_local_buf[3] = 'a';
  joinResult.field_2._M_local_buf[4] = '/';
  joinResult.field_2._M_local_buf[5] = '.';
  joinResult.field_2._M_local_buf[6] = '.';
  joinResult.field_2._M_local_buf[7] = '/';
  joinResult.field_2._M_local_buf[8] = 'b';
  joinResult.field_2._M_local_buf[9] = '\0';
  joinResult._M_string_length = 9;
  test.field_2._M_local_buf[0] = '.';
  test.field_2._M_local_buf[1] = '.';
  test.field_2._M_local_buf[2] = '/';
  test.field_2._M_local_buf[3] = 'b';
  test._M_string_length = 4;
  test.field_2._M_local_buf[4] = '\0';
  test._M_dataplus._M_p = (pointer)&test.field_2;
  bVar31 = CheckCollapsePath(&joinResult,&test,"../rel");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  joinResult.field_2._M_allocated_capacity._0_2_ = 0x2f61;
  joinResult.field_2._M_local_buf[2] = '.';
  joinResult.field_2._M_local_buf[3] = '.';
  joinResult.field_2._M_local_buf[4] = '/';
  joinResult.field_2._M_local_buf[5] = 'b';
  joinResult._M_string_length = 6;
  joinResult.field_2._M_local_buf[6] = '\0';
  test.field_2._M_local_buf[0] = '.';
  test.field_2._M_local_buf[1] = '.';
  test.field_2._M_local_buf[2] = '/';
  test.field_2._M_local_buf[3] = 'r';
  test.field_2._M_local_buf[4] = 'e';
  test.field_2._M_local_buf[5] = 'l';
  test.field_2._M_local_buf[6] = '/';
  test.field_2._M_local_buf[7] = 'b';
  test._M_string_length = 8;
  test.field_2._M_local_buf[8] = '\0';
  test._M_dataplus._M_p = (pointer)&test.field_2;
  bVar32 = CheckCollapsePath(&joinResult,&test,"../rel");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  __dnew_2 = (size_type)anon_var_dwarf_8624;
  originalPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  originalPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  originalPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char_const*&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&originalPaths,
             (char **)&__dnew_2);
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char_const*&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&lines,
             (char **)&__dnew_2);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[21]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&lines,
             (char (*) [21])"/Somewhere/something");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[5]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&lines,
             (char (*) [5])0x12f498);
  __dnew_1 = (size_type)&local_4f8;
  local_4f8._M_local_buf[0] = 'S';
  local_4f8._M_local_buf[1] = '\0';
  local_500 = (pointer)0x1;
  plVar42 = (long *)std::__cxx11::string::append((char *)&__dnew_1);
  test._M_dataplus._M_p = (pointer)&test.field_2;
  plVar46 = plVar42 + 2;
  if ((long *)*plVar42 == plVar46) {
    lVar58 = *plVar46;
    lVar3 = plVar42[3];
    test.field_2._M_local_buf[0] = (char)lVar58;
    test.field_2._M_local_buf[1] = (char)((ulong)lVar58 >> 8);
    test.field_2._M_local_buf[2] = (char)((ulong)lVar58 >> 0x10);
    test.field_2._M_local_buf[3] = (char)((ulong)lVar58 >> 0x18);
    test.field_2._M_local_buf[4] = (char)((ulong)lVar58 >> 0x20);
    test.field_2._M_local_buf[5] = (char)((ulong)lVar58 >> 0x28);
    test.field_2._M_local_buf[6] = (char)((ulong)lVar58 >> 0x30);
    test.field_2._M_local_buf[7] = (char)((ulong)lVar58 >> 0x38);
    test.field_2._M_local_buf[8] = (char)lVar3;
    test.field_2._M_local_buf[9] = (char)((ulong)lVar3 >> 8);
    test.field_2._10_2_ = (undefined2)((ulong)lVar3 >> 0x10);
    test.field_2._M_local_buf[0xc] = (char)((ulong)lVar3 >> 0x20);
    test.field_2._M_local_buf[0xd] = (char)((ulong)lVar3 >> 0x28);
    test.field_2._M_local_buf[0xe] = (char)((ulong)lVar3 >> 0x30);
    test.field_2._M_local_buf[0xf] = (char)((ulong)lVar3 >> 0x38);
  }
  else {
    lVar58 = *plVar46;
    test.field_2._M_local_buf[0] = (char)lVar58;
    test.field_2._M_local_buf[1] = (char)((ulong)lVar58 >> 8);
    test.field_2._M_local_buf[2] = (char)((ulong)lVar58 >> 0x10);
    test.field_2._M_local_buf[3] = (char)((ulong)lVar58 >> 0x18);
    test.field_2._M_local_buf[4] = (char)((ulong)lVar58 >> 0x20);
    test.field_2._M_local_buf[5] = (char)((ulong)lVar58 >> 0x28);
    test.field_2._M_local_buf[6] = (char)((ulong)lVar58 >> 0x30);
    test.field_2._M_local_buf[7] = (char)((ulong)lVar58 >> 0x38);
    test._M_dataplus._M_p = (pointer)*plVar42;
  }
  test._M_string_length = plVar42[1];
  *plVar42 = (long)plVar46;
  plVar42[1] = 0;
  *(undefined1 *)(plVar42 + 2) = 0;
  plVar42 = (long *)std::__cxx11::string::append((char *)&test);
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  plVar46 = plVar42 + 2;
  if ((long *)*plVar42 == plVar46) {
    lVar58 = *plVar46;
    lVar3 = plVar42[3];
    joinResult.field_2._M_allocated_capacity._0_2_ = (undefined2)lVar58;
    joinResult.field_2._M_local_buf[2] = (char)((ulong)lVar58 >> 0x10);
    joinResult.field_2._M_local_buf[3] = (char)((ulong)lVar58 >> 0x18);
    joinResult.field_2._M_local_buf[4] = (char)((ulong)lVar58 >> 0x20);
    joinResult.field_2._M_local_buf[5] = (char)((ulong)lVar58 >> 0x28);
    joinResult.field_2._M_local_buf[6] = (char)((ulong)lVar58 >> 0x30);
    joinResult.field_2._M_local_buf[7] = (char)((ulong)lVar58 >> 0x38);
    joinResult.field_2._M_local_buf[8] = (char)lVar3;
    joinResult.field_2._M_local_buf[9] = (char)((ulong)lVar3 >> 8);
    joinResult.field_2._M_local_buf[10] = (char)((ulong)lVar3 >> 0x10);
    joinResult.field_2._M_local_buf[0xb] = (char)((ulong)lVar3 >> 0x18);
    joinResult.field_2._M_local_buf[0xc] = (char)((ulong)lVar3 >> 0x20);
    joinResult.field_2._M_local_buf[0xd] = (char)((ulong)lVar3 >> 0x28);
    joinResult.field_2._14_2_ = (undefined2)((ulong)lVar3 >> 0x30);
  }
  else {
    lVar58 = *plVar46;
    joinResult.field_2._M_allocated_capacity._0_2_ = (undefined2)lVar58;
    joinResult.field_2._M_local_buf[2] = (char)((ulong)lVar58 >> 0x10);
    joinResult.field_2._M_local_buf[3] = (char)((ulong)lVar58 >> 0x18);
    joinResult.field_2._M_local_buf[4] = (char)((ulong)lVar58 >> 0x20);
    joinResult.field_2._M_local_buf[5] = (char)((ulong)lVar58 >> 0x28);
    joinResult.field_2._M_local_buf[6] = (char)((ulong)lVar58 >> 0x30);
    joinResult.field_2._M_local_buf[7] = (char)((ulong)lVar58 >> 0x38);
    joinResult._M_dataplus._M_p = (pointer)*plVar42;
  }
  joinResult._M_string_length = plVar42[1];
  *plVar42 = (long)plVar46;
  plVar42[1] = 0;
  *(undefined1 *)(plVar42 + 2) = 0;
  bVar33 = CheckPutEnv(&joinResult,"S","/Somewhere/something:/tmp");
  local_94 = (undefined4)CONCAT71(extraout_var_00,bVar33);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__dnew_1 != &local_4f8) {
    operator_delete((void *)__dnew_1,
                    CONCAT26(local_4f8._M_allocated_capacity._6_2_,
                             CONCAT24(local_4f8._M_allocated_capacity._4_2_,
                                      CONCAT22(local_4f8._M_allocated_capacity._2_2_,
                                               CONCAT11(local_4f8._M_local_buf[1],
                                                        local_4f8._M_local_buf[0])))) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&linesToJoin,&originalPaths);
  cmsys::SystemTools::GetPath(&linesToJoin,"S");
  if (((long)linesToJoin.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)linesToJoin.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
       (long)lines.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)lines.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start) ||
     (bVar33 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                         (linesToJoin.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          linesToJoin.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          lines.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start), !bVar33)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"GetPath(",8);
    StringVectorToString(&joinResult,&originalPaths);
    poVar40 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,joinResult._M_dataplus._M_p,
                         joinResult._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar40,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar40,"S",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar40,")  yielded ",0xb);
    StringVectorToString(&test,&linesToJoin);
    poVar40 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar40,test._M_dataplus._M_p,test._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar40," instead of ",0xc);
    StringVectorToString((string *)&__dnew_1,&lines);
    poVar40 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar40,(char *)__dnew_1,(long)local_500);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar40 + -0x18) + (char)poVar40);
    std::ostream::put((char)poVar40);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__dnew_1 != &local_4f8) {
      operator_delete((void *)__dnew_1,
                      CONCAT26(local_4f8._M_allocated_capacity._6_2_,
                               CONCAT24(local_4f8._M_allocated_capacity._4_2_,
                                        CONCAT22(local_4f8._M_allocated_capacity._2_2_,
                                                 CONCAT11(local_4f8._M_local_buf[1],
                                                          local_4f8._M_local_buf[0])))) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)test._M_dataplus._M_p != &test.field_2) {
      operator_delete(test._M_dataplus._M_p,
                      CONCAT17(test.field_2._M_local_buf[7],
                               CONCAT16(test.field_2._M_local_buf[6],
                                        CONCAT15(test.field_2._M_local_buf[5],
                                                 CONCAT14(test.field_2._M_local_buf[4],
                                                          CONCAT13(test.field_2._M_local_buf[3],
                                                                   CONCAT12(test.field_2.
                                                                            _M_local_buf[2],
                                                                            CONCAT11(test.field_2.
                                                                                     _M_local_buf[1]
                                                                                     ,test.field_2.
                                                                                      _M_local_buf
                                                                                      [0]))))))) + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
      operator_delete(joinResult._M_dataplus._M_p,
                      CONCAT17(joinResult.field_2._M_local_buf[7],
                               CONCAT16(joinResult.field_2._M_local_buf[6],
                                        CONCAT15(joinResult.field_2._M_local_buf[5],
                                                 CONCAT14(joinResult.field_2._M_local_buf[4],
                                                          CONCAT13(joinResult.field_2._M_local_buf
                                                                   [3],CONCAT12(joinResult.field_2.
                                                                                _M_local_buf[2],
                                                                                joinResult.field_2.
                                                                                                                                                                
                                                  _M_allocated_capacity._0_2_)))))) + 1);
    }
    local_94 = 0;
  }
  bVar33 = CheckUnPutEnv("S","S");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&linesToJoin);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&lines);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&originalPaths);
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  test._M_dataplus._M_p = (pointer)0x10;
  joinResult._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&joinResult,(ulong)&test);
  joinResult.field_2._M_allocated_capacity._0_2_ = SUB82(test._M_dataplus._M_p,0);
  joinResult.field_2._M_local_buf[2] = (char)((ulong)test._M_dataplus._M_p >> 0x10);
  joinResult.field_2._M_local_buf[3] = (char)((ulong)test._M_dataplus._M_p >> 0x18);
  joinResult.field_2._M_local_buf[4] = (char)((ulong)test._M_dataplus._M_p >> 0x20);
  joinResult.field_2._M_local_buf[5] = (char)((ulong)test._M_dataplus._M_p >> 0x28);
  joinResult.field_2._M_local_buf[6] = (char)((ulong)test._M_dataplus._M_p >> 0x30);
  joinResult.field_2._M_local_buf[7] = (char)((ulong)test._M_dataplus._M_p >> 0x38);
  builtin_strncpy(joinResult._M_dataplus._M_p,"testFindFile.txt",0x10);
  joinResult._M_string_length = (size_type)test._M_dataplus._M_p;
  joinResult._M_dataplus._M_p[(long)test._M_dataplus._M_p] = '\0';
  std::operator+(&test,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/build_O1/Source/kwsys/"
                 ,&joinResult);
  SVar43 = cmsys::SystemTools::Touch(&test,true);
  if (SVar43.Kind_ == Success) {
    originalPaths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    originalPaths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    originalPaths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[94]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&originalPaths,
               (char (*) [94])
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/build_O1/Source/kwsys"
              );
    cmsys::SystemTools::FindFile((string *)&__dnew_1,&joinResult,&originalPaths,true);
    pbVar49 = local_500;
    uVar47 = CONCAT71((int7)(uVar55 >> 8),local_500 != (pointer)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__dnew_1 != &local_4f8) {
      operator_delete((void *)__dnew_1,
                      CONCAT26(local_4f8._M_allocated_capacity._6_2_,
                               CONCAT24(local_4f8._M_allocated_capacity._4_2_,
                                        CONCAT22(local_4f8._M_allocated_capacity._2_2_,
                                                 CONCAT11(local_4f8._M_local_buf[1],
                                                          local_4f8._M_local_buf[0])))) + 1);
    }
    if (pbVar49 == (pointer)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Problem with FindFile without system paths for: ",0x30);
      poVar40 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,joinResult._M_dataplus._M_p,
                           joinResult._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar40 + -0x18) + (char)poVar40);
      std::ostream::put((char)poVar40);
      std::ostream::flush();
    }
    cmsys::SystemTools::FindFile((string *)&__dnew_1,&joinResult,&originalPaths,false);
    pbVar49 = local_500;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__dnew_1 != &local_4f8) {
      operator_delete((void *)__dnew_1,
                      CONCAT26(local_4f8._M_allocated_capacity._6_2_,
                               CONCAT24(local_4f8._M_allocated_capacity._4_2_,
                                        CONCAT22(local_4f8._M_allocated_capacity._2_2_,
                                                 CONCAT11(local_4f8._M_local_buf[1],
                                                          local_4f8._M_local_buf[0])))) + 1);
    }
    if (pbVar49 == (pointer)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Problem with FindFile with system paths for: ",0x2d);
      poVar40 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,joinResult._M_dataplus._M_p,
                           joinResult._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar40 + -0x18) + (char)poVar40);
      std::ostream::put((char)poVar40);
      std::ostream::flush();
      uVar47 = 0;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&originalPaths);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with Touch for: ",0x18);
    poVar40 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,test._M_dataplus._M_p,test._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar40 + -0x18) + (char)poVar40);
    std::ostream::put((char)poVar40);
    std::ostream::flush();
    uVar47 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  joinResult.field_2._M_allocated_capacity._0_2_ = 0x662f;
  joinResult.field_2._M_local_buf[2] = 'o';
  joinResult.field_2._M_local_buf[3] = 'o';
  joinResult._M_string_length = 4;
  joinResult.field_2._M_local_buf[4] = '\0';
  test.field_2._M_local_buf[0] = '/';
  test.field_2._M_local_buf[1] = '\0';
  test._M_string_length = 1;
  test._M_dataplus._M_p = (pointer)&test.field_2;
  bVar34 = cmsys::SystemTools::IsSubDirectory(&joinResult,&test);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  local_68 = (undefined4)uVar47;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  if (!bVar34) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with IsSubDirectory (root - unix): ",0x2b);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
  }
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  joinResult.field_2._M_allocated_capacity._0_2_ = 0x3a63;
  joinResult.field_2._M_local_buf[2] = '/';
  joinResult.field_2._M_local_buf[3] = 'f';
  joinResult.field_2._M_local_buf[4] = 'o';
  joinResult.field_2._M_local_buf[5] = 'o';
  joinResult._M_string_length = 6;
  joinResult.field_2._M_local_buf[6] = '\0';
  test.field_2._M_local_buf[0] = 'c';
  test.field_2._M_local_buf[1] = ':';
  test.field_2._M_local_buf[2] = '/';
  test.field_2._M_local_buf[3] = '\0';
  test._M_string_length = 3;
  test._M_dataplus._M_p = (pointer)&test.field_2;
  bVar35 = cmsys::SystemTools::IsSubDirectory(&joinResult,&test);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  if (!bVar35) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with IsSubDirectory (root - dos): ",0x2a);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    bVar34 = false;
  }
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  joinResult.field_2._M_allocated_capacity._0_2_ = 0x662f;
  joinResult.field_2._M_local_buf[2] = 'o';
  joinResult.field_2._M_local_buf[3] = 'o';
  joinResult.field_2._M_local_buf[4] = '/';
  joinResult.field_2._M_local_buf[5] = 'b';
  joinResult.field_2._M_local_buf[6] = 'a';
  joinResult.field_2._M_local_buf[7] = 'r';
  joinResult._M_string_length = 8;
  joinResult.field_2._M_local_buf[8] = '\0';
  test.field_2._M_local_buf[0] = '/';
  test.field_2._M_local_buf[1] = 'f';
  test.field_2._M_local_buf[2] = 'o';
  test.field_2._M_local_buf[3] = 'o';
  test._M_string_length = 4;
  test.field_2._M_local_buf[4] = '\0';
  test._M_dataplus._M_p = (pointer)&test.field_2;
  bVar35 = cmsys::SystemTools::IsSubDirectory(&joinResult,&test);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  if (!bVar35) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with IsSubDirectory (deep): ",0x24);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    bVar34 = false;
  }
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  joinResult.field_2._M_allocated_capacity._0_2_ = 0x662f;
  joinResult.field_2._M_local_buf[2] = 'o';
  joinResult.field_2._M_local_buf[3] = 'o';
  joinResult._M_string_length = 4;
  joinResult.field_2._M_local_buf[4] = '\0';
  test.field_2._M_local_buf[0] = '/';
  test.field_2._M_local_buf[1] = 'f';
  test.field_2._M_local_buf[2] = 'o';
  test.field_2._M_local_buf[3] = 'o';
  test._M_string_length = 4;
  test.field_2._M_local_buf[4] = '\0';
  test._M_dataplus._M_p = (pointer)&test.field_2;
  bVar35 = cmsys::SystemTools::IsSubDirectory(&joinResult,&test);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  if (bVar35) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with IsSubDirectory (identity): ",0x28);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    bVar34 = false;
  }
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  joinResult.field_2._M_allocated_capacity._0_2_ = 0x662f;
  joinResult.field_2._M_local_buf[2] = 'o';
  joinResult.field_2._M_local_buf[3] = 'o';
  joinResult.field_2._M_local_buf[4] = 'o';
  joinResult.field_2._M_local_buf[5] = '\0';
  joinResult._M_string_length = 5;
  test.field_2._M_local_buf[0] = '/';
  test.field_2._M_local_buf[1] = 'f';
  test.field_2._M_local_buf[2] = 'o';
  test.field_2._M_local_buf[3] = 'o';
  test._M_string_length = 4;
  test.field_2._M_local_buf[4] = '\0';
  test._M_dataplus._M_p = (pointer)&test.field_2;
  bVar35 = cmsys::SystemTools::IsSubDirectory(&joinResult,&test);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  if (bVar35) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with IsSubDirectory (substring): ",0x29);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    bVar34 = false;
  }
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  joinResult.field_2._M_allocated_capacity._0_2_ = 0x662f;
  joinResult.field_2._M_local_buf[2] = 'o';
  joinResult.field_2._M_local_buf[3] = 'o';
  joinResult.field_2._M_local_buf[4] = '/';
  joinResult.field_2._M_local_buf[5] = '\0';
  joinResult._M_string_length = 5;
  test.field_2._M_local_buf[0] = '/';
  test.field_2._M_local_buf[1] = 'f';
  test.field_2._M_local_buf[2] = 'o';
  test.field_2._M_local_buf[3] = 'o';
  test._M_string_length = 4;
  test.field_2._M_local_buf[4] = '\0';
  test._M_dataplus._M_p = (pointer)&test.field_2;
  bVar35 = cmsys::SystemTools::IsSubDirectory(&joinResult,&test);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  if (bVar35) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with IsSubDirectory (prepended slash): ",0x2f);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    bVar34 = false;
  }
  test._M_dataplus._M_p = (pointer)&test.field_2;
  joinResult._M_dataplus._M_p = (pointer)0x5f;
  pcVar44 = (pointer)std::__cxx11::string::_M_create((ulong *)&test,(ulong)&joinResult);
  _Var4 = joinResult._M_dataplus;
  test.field_2._M_local_buf[0] = (char)joinResult._M_dataplus._M_p;
  test.field_2._M_local_buf[1] = (char)((ulong)joinResult._M_dataplus._M_p >> 8);
  test.field_2._M_local_buf[2] = (char)((ulong)joinResult._M_dataplus._M_p >> 0x10);
  test.field_2._M_local_buf[3] = (char)((ulong)joinResult._M_dataplus._M_p >> 0x18);
  test.field_2._M_local_buf[4] = (char)((ulong)joinResult._M_dataplus._M_p >> 0x20);
  test.field_2._M_local_buf[5] = (char)((ulong)joinResult._M_dataplus._M_p >> 0x28);
  test.field_2._M_local_buf[6] = (char)((ulong)joinResult._M_dataplus._M_p >> 0x30);
  test.field_2._M_local_buf[7] = (char)((ulong)joinResult._M_dataplus._M_p >> 0x38);
  test._M_dataplus._M_p = pcVar44;
  memcpy(pcVar44,
         "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/kwsys/README.rst"
         ,0x5f);
  test._M_string_length = (size_type)_Var4._M_p;
  pcVar44[_Var4._M_p] = '\0';
  std::ifstream::ifstream(&joinResult,test._M_dataplus._M_p,_S_in);
  if ((*(byte *)((long)&local_410 + *(long *)(joinResult._M_dataplus._M_p + -0x18)) & 5) == 0) {
    __dnew_1 = (size_type)&local_4f8;
    local_500 = (pointer)0x0;
    local_4f8._M_local_buf[0] = '\0';
    originalPaths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)originalPaths.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
    std::istream::seekg((long)&joinResult,_S_beg);
    bVar35 = cmsys::SystemTools::GetLineFromStream
                       ((istream *)&joinResult,(string *)&__dnew_1,(bool *)&originalPaths,
                        0xffffffffffffffff);
    if (bVar35 && local_500 == (pointer)0x5) {
      std::istream::seekg((long)&joinResult,_S_beg);
      bVar35 = cmsys::SystemTools::GetLineFromStream
                         ((istream *)&joinResult,(string *)&__dnew_1,(bool *)&originalPaths,
                          0xffffffffffffffff);
      if (!bVar35 || local_500 != (pointer)0x5) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"First line does not have five characters after rewind: ",
                   0x37);
        poVar40 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar40 + -0x18) + (char)poVar40);
        goto LAB_0010aaef;
      }
      uVar47 = CONCAT71((int7)((ulong)uVar47 >> 8),1);
      pbVar49 = (pointer)0x1;
      do {
        std::istream::seekg((long)&joinResult,_S_beg);
        bVar35 = cmsys::SystemTools::GetLineFromStream
                           ((istream *)&joinResult,(string *)&__dnew_1,(bool *)&originalPaths,
                            (size_type)pbVar49);
        if (!bVar35 || pbVar49 != local_500) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Should have read ",0x11);
          poVar40 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>(poVar40," characters but got ",0x14);
          poVar40 = std::ostream::_M_insert<unsigned_long>((ulong)poVar40);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar40 + -0x18) + (char)poVar40);
          std::ostream::put((char)poVar40);
          std::ostream::flush();
          uVar47 = 0;
        }
        uVar53 = (undefined4)uVar47;
        pbVar49 = (pointer)((long)&(pbVar49->_M_dataplus)._M_p + 1);
      } while (pbVar49 != (pointer)0x6);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"First line does not have five characters: ",0x2a);
      poVar40 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar40 + -0x18) + (char)poVar40);
LAB_0010aaef:
      std::ostream::put((char)poVar40);
      std::ostream::flush();
      uVar53 = 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__dnew_1 != &local_4f8) {
      operator_delete((void *)__dnew_1,
                      CONCAT26(local_4f8._M_allocated_capacity._6_2_,
                               CONCAT24(local_4f8._M_allocated_capacity._4_2_,
                                        CONCAT22(local_4f8._M_allocated_capacity._2_2_,
                                                 CONCAT11(local_4f8._M_local_buf[1],
                                                          local_4f8._M_local_buf[0])))) + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem opening: ",0x11);
    poVar40 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,test._M_dataplus._M_p,test._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar40 + -0x18) + (char)poVar40);
    std::ostream::put((char)poVar40);
    std::ostream::flush();
    uVar53 = 0;
  }
  std::ifstream::~ifstream(&joinResult);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  test._M_dataplus._M_p = (pointer)&test.field_2;
  test.field_2._M_local_buf[0] = 'l';
  test.field_2._M_local_buf[1] = 'o';
  test.field_2._M_local_buf[2] = 'n';
  test.field_2._M_local_buf[3] = 'g';
  test.field_2._M_local_buf[4] = 'l';
  test.field_2._M_local_buf[5] = 'i';
  test.field_2._M_local_buf[6] = 'n';
  test.field_2._M_local_buf[7] = 'e';
  test.field_2._M_local_buf[8] = 's';
  test.field_2._M_local_buf[9] = '.';
  test.field_2._10_2_ = 0x7874;
  test.field_2._M_local_buf[0xc] = 't';
  test._M_string_length = 0xd;
  test.field_2._M_local_buf[0xd] = '\0';
  __dnew_1 = (size_type)&local_4f8;
  local_500 = (pointer)0x0;
  local_4f8._M_local_buf[0] = '\0';
  originalPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&originalPaths.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  originalPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  originalPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)originalPaths.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
  std::__cxx11::string::_M_replace_aux((ulong)&__dnew_1,0,0,'\x02');
  std::__cxx11::string::append((char *)&__dnew_1);
  std::__cxx11::string::_M_replace_aux
            ((ulong)&originalPaths,0,
             (ulong)originalPaths.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,'\x02');
  std::__cxx11::string::append((char *)&originalPaths);
  local_6c = uVar53;
  std::ofstream::ofstream(&joinResult,test._M_dataplus._M_p,_S_bin);
  uVar54 = *(uint *)((long)&local_410 + *(long *)(joinResult._M_dataplus._M_p + -0x18));
  if ((uVar54 & 5) == 0) {
    poVar40 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&joinResult,(char *)__dnew_1,(long)local_500);
    std::__ostream_insert<char,std::char_traits<char>>(poVar40,"\r\n\n",3);
    poVar40 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar40,(char *)originalPaths.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start,
                         (long)originalPaths.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
    std::__ostream_insert<char,std::char_traits<char>>(poVar40,"\n",1);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem opening for write: ",0x1b);
    poVar40 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,test._M_dataplus._M_p,test._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar40 + -0x18) + (char)poVar40);
    std::ostream::put((char)poVar40);
    std::ostream::flush();
  }
  joinResult._M_dataplus._M_p = _VTT;
  *(undefined8 *)((long)&joinResult._M_dataplus._M_p + *(long *)(_VTT + -0x18)) = _strtod;
  std::filebuf::~filebuf((filebuf *)&joinResult._M_string_length);
  std::ios_base::~ios_base(local_338);
  if ((uVar54 & 5) != 0) {
    local_454 = 0;
    goto LAB_0010af0f;
  }
  std::ifstream::ifstream(&joinResult,test._M_dataplus._M_p,_S_bin);
  if ((*(byte *)((long)&local_410 + *(long *)(joinResult._M_dataplus._M_p + -0x18)) & 5) == 0) {
    ppbVar45 = &lines.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)lines.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    linesToJoin.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)linesToJoin.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
    lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar45;
    bVar35 = cmsys::SystemTools::GetLineFromStream
                       ((istream *)&joinResult,(string *)&lines,(bool *)&linesToJoin,
                        0xffffffffffffffff);
    if (((bVar35) &&
        (lines.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish == local_500)) &&
       ((lines.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0 ||
        (iVar39 = bcmp(lines.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,(void *)__dnew_1,
                       (size_t)lines.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish), iVar39 == 0)))) {
      if ((char)linesToJoin.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == '\0') {
        poVar40 = (ostream *)&std::cerr;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Expected new line to be read from first line",0x2c);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
        goto LAB_0010aec9;
      }
      linesToJoin.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)linesToJoin.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
      bVar35 = cmsys::SystemTools::GetLineFromStream
                         ((istream *)&joinResult,(string *)&lines,(bool *)&linesToJoin,
                          0xffffffffffffffff);
      if (!bVar35 ||
          lines.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Expected successful read with an empty line, got ",0x31);
        poVar40 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar40," characters",0xb);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar40 + -0x18) + (char)poVar40);
        goto LAB_0010aec9;
      }
      if ((char)linesToJoin.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != '\x01') {
        lVar58 = 0x2e;
        pcVar56 = "Expected new line to be read for an empty line";
LAB_0010c24b:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar56,lVar58);
        poVar40 = (ostream *)&std::cerr;
LAB_0010c25d:
        std::endl<char,std::char_traits<char>>(poVar40);
        goto LAB_0010aedc;
      }
      linesToJoin.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)linesToJoin.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
      bVar35 = cmsys::SystemTools::GetLineFromStream
                         ((istream *)&joinResult,(string *)&lines,(bool *)&linesToJoin,
                          0xffffffffffffffff);
      if (((!bVar35) ||
          (lines.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish !=
           originalPaths.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)) ||
         ((lines.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0 &&
          (iVar39 = bcmp(lines.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         originalPaths.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (size_t)lines.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish), iVar39 != 0)))) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Second line does not match, expected ",0x25);
        poVar40 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar40," characters, got ",0x11);
        poVar40 = std::ostream::_M_insert<unsigned_long>((ulong)poVar40);
        goto LAB_0010c25d;
      }
      local_454 = 1;
      if ((char)linesToJoin.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == '\0') {
        lVar58 = 0x2d;
        pcVar56 = "Expected new line to be read from second line";
        goto LAB_0010c24b;
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"First line does not match, expected ",0x24);
      poVar40 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar40," characters, got ",0x11);
      poVar40 = std::ostream::_M_insert<unsigned_long>((ulong)poVar40);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar40 + -0x18) + (char)poVar40);
LAB_0010aec9:
      std::ostream::put((char)poVar40);
      std::ostream::flush();
LAB_0010aedc:
      local_454 = 0;
    }
    if (lines.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar45) {
      operator_delete(lines.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((lines.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem opening: ",0x11);
    poVar40 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,test._M_dataplus._M_p,test._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar40 + -0x18) + (char)poVar40);
    std::ostream::put((char)poVar40);
    std::ostream::flush();
    local_454 = 0;
  }
  std::ifstream::~ifstream(&joinResult);
LAB_0010af0f:
  if (originalPaths.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&originalPaths.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(originalPaths.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((originalPaths.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__dnew_1 != &local_4f8) {
    operator_delete((void *)__dnew_1,
                    CONCAT26(local_4f8._M_allocated_capacity._6_2_,
                             CONCAT24(local_4f8._M_allocated_capacity._4_2_,
                                      CONCAT22(local_4f8._M_allocated_capacity._2_2_,
                                               CONCAT11(local_4f8._M_local_buf[1],
                                                        local_4f8._M_local_buf[0])))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  test._M_dataplus._M_p = (pointer)0x16;
  joinResult._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&joinResult,(ulong)&test);
  joinResult.field_2._M_allocated_capacity._0_2_ = SUB82(test._M_dataplus._M_p,0);
  joinResult.field_2._M_local_buf[2] = (char)((ulong)test._M_dataplus._M_p >> 0x10);
  joinResult.field_2._M_local_buf[3] = (char)((ulong)test._M_dataplus._M_p >> 0x18);
  joinResult.field_2._M_local_buf[4] = (char)((ulong)test._M_dataplus._M_p >> 0x20);
  joinResult.field_2._M_local_buf[5] = (char)((ulong)test._M_dataplus._M_p >> 0x28);
  joinResult.field_2._M_local_buf[6] = (char)((ulong)test._M_dataplus._M_p >> 0x30);
  joinResult.field_2._M_local_buf[7] = (char)((ulong)test._M_dataplus._M_p >> 0x38);
  builtin_strncpy(joinResult._M_dataplus._M_p,"C:\\somewhere\\something",0x16);
  joinResult._M_string_length = (size_type)test._M_dataplus._M_p;
  joinResult._M_dataplus._M_p[(long)test._M_dataplus._M_p] = '\0';
  test._M_dataplus._M_p = (pointer)&test.field_2;
  test.field_2._M_local_buf[0] = 's';
  test.field_2._M_local_buf[1] = 'o';
  test.field_2._M_local_buf[2] = 'm';
  test.field_2._M_local_buf[3] = 'e';
  test.field_2._M_local_buf[4] = 't';
  test.field_2._M_local_buf[5] = 'h';
  test.field_2._M_local_buf[6] = 'i';
  test.field_2._M_local_buf[7] = 'n';
  test.field_2._M_local_buf[8] = 'g';
  test.field_2._M_local_buf[9] = '\0';
  test._M_string_length = 9;
  originalPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&originalPaths.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x16;
  originalPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)std::__cxx11::string::_M_create((ulong *)&originalPaths,(ulong)&lines);
  originalPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       lines.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  ((originalPaths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p = (pointer)0x77656d6f735c3a43;
  (originalPaths.
   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
   ._M_impl.super__Vector_impl_data._M_start)->_M_string_length = 0x6d6f735c65726568;
  *(undefined8 *)
   ((long)&(originalPaths.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->_M_string_length + 6) = 0x676e696874656d6f;
  originalPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       lines.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(undefined1 *)
   ((long)&((originalPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
   (long)&((lines.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p) = 0;
  cmsys::SystemTools::GetFilenameName((string *)&__dnew_1,(string *)&originalPaths);
  if (originalPaths.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&originalPaths.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(originalPaths.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((originalPaths.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  uVar2 = (uint3)(uVar54 >> 8);
  uVar54 = (uint)CONCAT71((uint7)uVar2,1);
  if (local_500 == (pointer)joinResult._M_string_length) {
    if (local_500 == (pointer)0x0) {
      uVar54 = 0;
    }
    else {
      iVar39 = bcmp((void *)__dnew_1,joinResult._M_dataplus._M_p,(size_t)local_500);
      uVar54 = CONCAT31(uVar2,iVar39 != 0);
    }
  }
  if ((char)uVar54 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"GetFilenameName(",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"C:\\somewhere\\something",0x16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,") yielded ",10);
    poVar40 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)__dnew_1,(long)local_500);
    std::__ostream_insert<char,std::char_traits<char>>(poVar40," instead of ",0xc);
    poVar40 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar40,joinResult._M_dataplus._M_p,joinResult._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar40 + -0x18) + (char)poVar40);
    std::ostream::put((char)poVar40);
    std::ostream::flush();
  }
  ppbVar45 = &lines.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  linesToJoin.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x14;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar45;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)std::__cxx11::string::_M_create((ulong *)&lines,(ulong)&linesToJoin);
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       linesToJoin.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  ((lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p = (pointer)0x656877656d6f732f;
  (lines.
   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
   ._M_impl.super__Vector_impl_data._M_start)->_M_string_length = 0x74656d6f732f6572;
  *(undefined4 *)
   &(lines.
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->field_2 = 0x676e6968;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       linesToJoin.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(undefined1 *)
   ((long)&((lines.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
   (long)&((linesToJoin.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p) = 0;
  cmsys::SystemTools::GetFilenameName((string *)&originalPaths,(string *)&lines);
  std::__cxx11::string::operator=((string *)&__dnew_1,(string *)&originalPaths);
  if (originalPaths.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&originalPaths.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(originalPaths.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((originalPaths.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (lines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar45) {
    operator_delete(lines.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((lines.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if ((local_500 != (pointer)test._M_string_length) ||
     ((uVar54 = uVar54 ^ 1, local_500 != (pointer)0x0 &&
      (iVar39 = bcmp((void *)__dnew_1,test._M_dataplus._M_p,(size_t)local_500), iVar39 != 0)))) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"GetFilenameName(",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"/somewhere/something",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,") yielded ",10);
    poVar40 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)__dnew_1,(long)local_500);
    std::__ostream_insert<char,std::char_traits<char>>(poVar40," instead of ",0xc);
    poVar40 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar40,test._M_dataplus._M_p,test._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar40 + -0x18) + (char)poVar40);
    std::ostream::put((char)poVar40);
    std::ostream::flush();
    uVar54 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__dnew_1 != &local_4f8) {
    operator_delete((void *)__dnew_1,
                    CONCAT26(local_4f8._M_allocated_capacity._6_2_,
                             CONCAT24(local_4f8._M_allocated_capacity._4_2_,
                                      CONCAT22(local_4f8._M_allocated_capacity._2_2_,
                                               CONCAT11(local_4f8._M_local_buf[1],
                                                        local_4f8._M_local_buf[0])))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  local_70 = uVar54;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  pbVar50 = &diff_test_cases[0].differ;
  uVar59 = 0;
  local_60 = 0;
  do {
    bVar35 = writeFile("file_a",((anon_struct_24_3_dff52ec8 *)(pbVar50 + -0x10))->a);
    if ((!bVar35) || (bVar35 = writeFile("file_b",*(char **)(pbVar50 + -8)), !bVar35)) break;
    joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
    uVar47 = 0x656c6966;
    joinResult.field_2._M_allocated_capacity._0_2_ = 0x6966;
    joinResult.field_2._M_local_buf[2] = 'l';
    joinResult.field_2._M_local_buf[3] = 'e';
    joinResult.field_2._M_local_buf[4] = '_';
    joinResult.field_2._M_local_buf[5] = 'a';
    joinResult._M_string_length = 6;
    joinResult.field_2._M_local_buf[6] = '\0';
    test.field_2._M_local_buf[0] = 'f';
    test.field_2._M_local_buf[1] = 'i';
    test.field_2._M_local_buf[2] = 'l';
    test.field_2._M_local_buf[3] = 'e';
    test.field_2._M_local_buf[4] = '_';
    test.field_2._M_local_buf[5] = 'b';
    test._M_string_length = 6;
    test.field_2._M_local_buf[6] = '\0';
    test._M_dataplus._M_p = (pointer)&test.field_2;
    bVar36 = cmsys::SystemTools::TextFilesDiffer(&joinResult,&test);
    bVar35 = *pbVar50;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)test._M_dataplus._M_p != &test.field_2) {
      operator_delete(test._M_dataplus._M_p,
                      CONCAT17(test.field_2._M_local_buf[7],
                               CONCAT16(test.field_2._M_local_buf[6],
                                        CONCAT15(test.field_2._M_local_buf[5],
                                                 CONCAT14(test.field_2._M_local_buf[4],
                                                          CONCAT13(test.field_2._M_local_buf[3],
                                                                   CONCAT12(test.field_2.
                                                                            _M_local_buf[2],
                                                                            CONCAT11(test.field_2.
                                                                                     _M_local_buf[1]
                                                                                     ,test.field_2.
                                                                                      _M_local_buf
                                                                                      [0]))))))) + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
      operator_delete(joinResult._M_dataplus._M_p,
                      CONCAT17(joinResult.field_2._M_local_buf[7],
                               CONCAT16(joinResult.field_2._M_local_buf[6],
                                        CONCAT15(joinResult.field_2._M_local_buf[5],
                                                 CONCAT14(joinResult.field_2._M_local_buf[4],
                                                          CONCAT13(joinResult.field_2._M_local_buf
                                                                   [3],CONCAT12(joinResult.field_2.
                                                                                _M_local_buf[2],
                                                                                joinResult.field_2.
                                                                                                                                                                
                                                  _M_allocated_capacity._0_2_)))))) + 1);
    }
    if (bVar35 != bVar36) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Incorrect TextFilesDiffer result for test case ",0x2f);
      poVar40 = (ostream *)std::ostream::operator<<(&std::cerr,(int)uVar59 + 1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar40,".",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar40 + -0x18) + (char)poVar40);
      std::ostream::put((char)poVar40);
      std::ostream::flush();
      break;
    }
    bVar35 = 7 < uVar59;
    uVar59 = uVar59 + 1;
    local_60 = CONCAT71((int7)((ulong)uVar47 >> 8),bVar35);
    pbVar50 = pbVar50 + 0x18;
  } while (uVar59 != 9);
  bVar52 = 1;
  ppcVar51 = &diff_test_cases[0].b;
  uVar59 = 0;
  do {
    bVar35 = writeFile("file_a",((anon_struct_24_3_dff52ec8 *)(ppcVar51 + -1))->a);
    if ((!bVar35) || (bVar35 = writeFile("file_b",*ppcVar51), !bVar35)) goto LAB_0010b8e4;
    pcVar56 = "file_b";
    if (uVar59 < 4) {
      pcVar56 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/build_O1/Source/kwsys/file_b"
      ;
    }
    joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
    joinResult.field_2._M_local_buf[4] = '_';
    joinResult.field_2._M_local_buf[5] = 'a';
    joinResult.field_2._M_allocated_capacity._0_2_ = 0x6966;
    joinResult.field_2._M_local_buf[2] = 'l';
    joinResult.field_2._M_local_buf[3] = 'e';
    joinResult._M_string_length = 6;
    joinResult.field_2._M_local_buf[6] = '\0';
    test._M_dataplus._M_p = (pointer)&test.field_2;
    lVar58 = 6;
    if (uVar59 < 4) {
      lVar58 = 100;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&test,pcVar56,pcVar56 + lVar58);
    CVar60 = cmsys::SystemTools::CopyFileIfDifferent(&joinResult,&test);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)test._M_dataplus._M_p != &test.field_2) {
      operator_delete(test._M_dataplus._M_p,
                      CONCAT17(test.field_2._M_local_buf[7],
                               CONCAT16(test.field_2._M_local_buf[6],
                                        CONCAT15(test.field_2._M_local_buf[5],
                                                 CONCAT14(test.field_2._M_local_buf[4],
                                                          CONCAT13(test.field_2._M_local_buf[3],
                                                                   CONCAT12(test.field_2.
                                                                            _M_local_buf[2],
                                                                            CONCAT11(test.field_2.
                                                                                     _M_local_buf[1]
                                                                                     ,test.field_2.
                                                                                      _M_local_buf
                                                                                      [0]))))))) + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
      operator_delete(joinResult._M_dataplus._M_p,
                      CONCAT17(joinResult.field_2._M_local_buf[7],
                               CONCAT16(joinResult.field_2._M_local_buf[6],
                                        CONCAT15(joinResult.field_2._M_local_buf[5],
                                                 CONCAT14(joinResult.field_2._M_local_buf[4],
                                                          CONCAT13(joinResult.field_2._M_local_buf
                                                                   [3],CONCAT12(joinResult.field_2.
                                                                                _M_local_buf[2],
                                                                                joinResult.field_2.
                                                                                                                                                                
                                                  _M_allocated_capacity._0_2_)))))) + 1);
    }
    if (CVar60.super_Status.Kind_ == Success) {
      std::ifstream::ifstream(&joinResult,pcVar56,_S_bin);
      std::__cxx11::stringstream::stringstream((stringstream *)&test);
      std::ostream::operator<<(&test.field_2,(streambuf *)joinResult.field_2._M_local_buf);
      std::__cxx11::stringbuf::str();
      if ((*(byte *)((long)&local_410 + *(long *)(joinResult._M_dataplus._M_p + -0x18)) & 5) == 0) {
        originalPaths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&originalPaths.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        paVar48 = &local_4f8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__dnew_1 != paVar48) {
          originalPaths.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)__dnew_1;
        }
        originalPaths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)CONCAT26(local_4f8._M_allocated_capacity._6_2_,
                               CONCAT24(local_4f8._M_allocated_capacity._4_2_,
                                        CONCAT22(local_4f8._M_allocated_capacity._2_2_,
                                                 CONCAT11(local_4f8._M_local_buf[1],
                                                          local_4f8._M_local_buf[0]))));
        originalPaths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = local_500;
        ppbVar45 = &local_500;
        __dnew_1 = (size_type)paVar48;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Failed to read file: ",0x15);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar56,lVar58);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
        std::ostream::put(' ');
        std::ostream::flush();
        paVar48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&originalPaths.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
        ppbVar45 = &originalPaths.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        originalPaths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)paVar48;
      }
      *ppbVar45 = (pointer)0x0;
      paVar48->_M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__dnew_1 != &local_4f8) {
        operator_delete((void *)__dnew_1,
                        CONCAT26(local_4f8._M_allocated_capacity._6_2_,
                                 CONCAT24(local_4f8._M_allocated_capacity._4_2_,
                                          CONCAT22(local_4f8._M_allocated_capacity._2_2_,
                                                   CONCAT11(local_4f8._M_local_buf[1],
                                                            local_4f8._M_local_buf[0])))) + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&test);
      std::ios_base::~ios_base(local_1a8);
      std::ifstream::~ifstream(&joinResult);
      iVar39 = std::__cxx11::string::compare((char *)&originalPaths);
      if (iVar39 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Incorrect CopyFileIfDifferent file contents in test case "
                   ,0x39);
        poVar40 = (ostream *)std::ostream::operator<<(&std::cerr,(int)uVar59 + 1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar40,".",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar40 + -0x18) + (char)poVar40);
        std::ostream::put((char)poVar40);
        std::ostream::flush();
        bVar52 = 0;
      }
      if (originalPaths.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&originalPaths.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(originalPaths.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((originalPaths.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"CopyFileIfDifferent() returned false for test case ",0x33);
      poVar40 = (ostream *)std::ostream::operator<<(&std::cerr,(int)uVar59 + 1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar40,".",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar40 + -0x18) + (char)poVar40);
      std::ostream::put((char)poVar40);
      std::ostream::flush();
      bVar52 = 0;
    }
    uVar59 = uVar59 + 1;
    ppcVar51 = ppcVar51 + 3;
  } while (uVar59 != 9);
  SVar43 = cmsys::SystemTools::MakeDirectory("dir_a",(mode_t *)0x0);
  if ((SVar43.Kind_ == Success) &&
     (SVar43 = cmsys::SystemTools::MakeDirectory("dir_b",(mode_t *)0x0), SVar43.Kind_ == Success)) {
    joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
    joinResult.field_2._M_allocated_capacity._0_2_ = 0x6964;
    joinResult.field_2._M_local_buf[2] = 'r';
    joinResult.field_2._M_local_buf[3] = '_';
    joinResult.field_2._M_local_buf[4] = 'a';
    joinResult.field_2._M_local_buf[5] = '/';
    joinResult._M_string_length = 6;
    joinResult.field_2._M_local_buf[6] = '\0';
    test.field_2._M_local_buf[0] = 'd';
    test.field_2._M_local_buf[1] = 'i';
    test.field_2._M_local_buf[2] = 'r';
    test.field_2._M_local_buf[3] = '_';
    test.field_2._M_local_buf[4] = 'b';
    test.field_2._M_local_buf[5] = '\0';
    test._M_string_length = 5;
    test._M_dataplus._M_p = (pointer)&test.field_2;
    CVar60 = cmsys::SystemTools::CopyFileIfDifferent(&joinResult,&test);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)test._M_dataplus._M_p != &test.field_2) {
      operator_delete(test._M_dataplus._M_p,
                      CONCAT17(test.field_2._M_local_buf[7],
                               CONCAT16(test.field_2._M_local_buf[6],
                                        CONCAT15(test.field_2._M_local_buf[5],
                                                 CONCAT14(test.field_2._M_local_buf[4],
                                                          CONCAT13(test.field_2._M_local_buf[3],
                                                                   CONCAT12(test.field_2.
                                                                            _M_local_buf[2],
                                                                            CONCAT11(test.field_2.
                                                                                     _M_local_buf[1]
                                                                                     ,test.field_2.
                                                                                      _M_local_buf
                                                                                      [0]))))))) + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
      operator_delete(joinResult._M_dataplus._M_p,
                      CONCAT17(joinResult.field_2._M_local_buf[7],
                               CONCAT16(joinResult.field_2._M_local_buf[6],
                                        CONCAT15(joinResult.field_2._M_local_buf[5],
                                                 CONCAT14(joinResult.field_2._M_local_buf[4],
                                                          CONCAT13(joinResult.field_2._M_local_buf
                                                                   [3],CONCAT12(joinResult.field_2.
                                                                                _M_local_buf[2],
                                                                                joinResult.field_2.
                                                                                                                                                                
                                                  _M_allocated_capacity._0_2_)))))) + 1);
    }
    bVar52 = CVar60.super_Status.Kind_ == Success & bVar52;
  }
  else {
LAB_0010b8e4:
    bVar52 = 0;
  }
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  test._M_dataplus._M_p = (pointer)0x28;
  joinResult._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&joinResult,(ulong)&test);
  joinResult.field_2._M_allocated_capacity._0_2_ = SUB82(test._M_dataplus._M_p,0);
  joinResult.field_2._M_local_buf[2] = (char)((ulong)test._M_dataplus._M_p >> 0x10);
  joinResult.field_2._M_local_buf[3] = (char)((ulong)test._M_dataplus._M_p >> 0x18);
  joinResult.field_2._M_local_buf[4] = (char)((ulong)test._M_dataplus._M_p >> 0x20);
  joinResult.field_2._M_local_buf[5] = (char)((ulong)test._M_dataplus._M_p >> 0x28);
  joinResult.field_2._M_local_buf[6] = (char)((ulong)test._M_dataplus._M_p >> 0x30);
  joinResult.field_2._M_local_buf[7] = (char)((ulong)test._M_dataplus._M_p >> 0x38);
  builtin_strncpy(joinResult._M_dataplus._M_p,"https://user:pw@hostname:42/full/url.com",0x28);
  joinResult._M_string_length = (size_type)test._M_dataplus._M_p;
  joinResult._M_dataplus._M_p[(long)test._M_dataplus._M_p] = '\0';
  test._M_dataplus._M_p = (pointer)&test.field_2;
  test._M_string_length = 0;
  test.field_2._M_local_buf[0] = '\0';
  local_500 = (pointer)0x0;
  local_4f8._M_local_buf[0] = '\0';
  originalPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&originalPaths.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  originalPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  originalPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)originalPaths.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&lines.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)lines.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
  linesToJoin.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&linesToJoin.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  linesToJoin.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  linesToJoin.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  __dnew_2 = (size_type)&local_80;
  local_88 = 0;
  local_80._M_local_buf[0] = '\0';
  __dnew_1 = (size_type)&local_4f8;
  cmsys::SystemTools::ParseURL
            (&joinResult,&test,(string *)&__dnew_1,(string *)&originalPaths,(string *)&lines,
             (string *)&linesToJoin,(string *)&__dnew_2,false);
  iVar39 = std::__cxx11::string::compare((char *)&test);
  if ((((iVar39 == 0) && (iVar39 = std::__cxx11::string::compare((char *)&__dnew_1), iVar39 == 0))
      && (iVar39 = std::__cxx11::string::compare((char *)&originalPaths), iVar39 == 0)) &&
     (((iVar39 = std::__cxx11::string::compare((char *)&lines), iVar39 == 0 &&
       (iVar39 = std::__cxx11::string::compare((char *)&linesToJoin), iVar39 == 0)) &&
      (iVar39 = std::__cxx11::string::compare((char *)&__dnew_2), iVar39 == 0)))) {
    bVar57 = 1;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Incorrect URL parsing",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    bVar57 = 0;
  }
  __dnew_16 = 0x58;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar44 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_50,(ulong)&__dnew_16);
  sVar5 = __dnew_16;
  local_50.field_2._M_allocated_capacity = __dnew_16;
  local_50._M_dataplus._M_p = pcVar44;
  memcpy(pcVar44,
         "file://hostname/path/to/a%20file%20with%20str%C3%A0ng%C3%A8%20ch%40r%20and%20s%C2%B5aces",
         0x58);
  local_50._M_string_length = sVar5;
  pcVar44[sVar5] = '\0';
  password = (string *)&originalPaths;
  cmsys::SystemTools::ParseURL
            (&local_50,&test,(string *)&__dnew_1,password,(string *)&lines,(string *)&linesToJoin,
             (string *)&__dnew_2,true);
  iVar39 = std::__cxx11::string::compare((char *)&test);
  if (((iVar39 != 0) || (iVar39 = std::__cxx11::string::compare((char *)&lines), iVar39 != 0)) ||
     (iVar39 = std::__cxx11::string::compare((char *)&__dnew_2), iVar39 != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Incorrect URL parsing or decoding",0x21);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    bVar57 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__dnew_2 != &local_80) {
    operator_delete((void *)__dnew_2,
                    CONCAT71(local_80._M_allocated_capacity._1_7_,local_80._M_local_buf[0]) + 1);
  }
  if (linesToJoin.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&linesToJoin.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(linesToJoin.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    CONCAT71(linesToJoin.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                             linesToJoin.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
  }
  if (lines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&lines.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(lines.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((lines.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (originalPaths.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&originalPaths.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(originalPaths.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((originalPaths.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__dnew_1 != &local_4f8) {
    operator_delete((void *)__dnew_1,
                    CONCAT26(local_4f8._M_allocated_capacity._6_2_,
                             CONCAT24(local_4f8._M_allocated_capacity._4_2_,
                                      CONCAT22(local_4f8._M_allocated_capacity._2_2_,
                                               CONCAT11(local_4f8._M_local_buf[1],
                                                        local_4f8._M_local_buf[0])))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test._M_dataplus._M_p != &test.field_2) {
    operator_delete(test._M_dataplus._M_p,
                    CONCAT17(test.field_2._M_local_buf[7],
                             CONCAT16(test.field_2._M_local_buf[6],
                                      CONCAT15(test.field_2._M_local_buf[5],
                                               CONCAT14(test.field_2._M_local_buf[4],
                                                        CONCAT13(test.field_2._M_local_buf[3],
                                                                 CONCAT12(test.field_2._M_local_buf
                                                                          [2],CONCAT11(test.field_2.
                                                                                       _M_local_buf
                                                                                       [1],test.
                                                  field_2._M_local_buf[0]))))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  joinResult.field_2._M_allocated_capacity._0_2_ = 0x6f6e;
  joinResult.field_2._M_local_buf[2] = 's';
  joinResult.field_2._M_local_buf[3] = 'e';
  joinResult.field_2._M_local_buf[4] = 'p';
  joinResult.field_2._M_local_buf[5] = '\0';
  joinResult._M_string_length = 5;
  test._M_dataplus._M_p = "nosep";
  expected._M_len = (size_type)password;
  expected._M_array = (iterator)0x1;
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  bVar35 = CheckSplitString::anon_class_1_0_00000001::operator()
                     ((anon_class_1_0_00000001 *)&joinResult,&test,expected);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  joinResult.field_2._M_allocated_capacity._0_2_ = 0x6966;
  joinResult.field_2._M_local_buf[2] = 'r';
  joinResult.field_2._M_local_buf[3] = 's';
  joinResult.field_2._M_local_buf[4] = 't';
  joinResult.field_2._M_local_buf[5] = '/';
  joinResult.field_2._M_local_buf[6] = 's';
  joinResult.field_2._M_local_buf[7] = 'e';
  joinResult.field_2._M_local_buf[8] = 'c';
  joinResult.field_2._M_local_buf[9] = 'o';
  joinResult.field_2._M_local_buf[10] = 'n';
  joinResult.field_2._M_local_buf[0xb] = 'd';
  joinResult._M_string_length = 0xc;
  joinResult.field_2._M_local_buf[0xc] = '\0';
  test._M_dataplus._M_p = "first";
  test._M_string_length = (long)"first/second" + 6;
  expected_00._M_len = (size_type)password;
  expected_00._M_array = (iterator)0x2;
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  bVar36 = CheckSplitString::anon_class_1_0_00000001::operator()
                     ((anon_class_1_0_00000001 *)&joinResult,&test,expected_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  joinResult.field_2._M_allocated_capacity._0_2_ = 0x732f;
  joinResult.field_2._M_local_buf[2] = 't';
  joinResult.field_2._M_local_buf[3] = 'a';
  joinResult.field_2._M_local_buf[4] = 'r';
  joinResult.field_2._M_local_buf[5] = 't';
  joinResult.field_2._M_local_buf[6] = 's';
  joinResult.field_2._M_local_buf[7] = '/';
  joinResult.field_2._M_local_buf[8] = 's';
  joinResult.field_2._M_local_buf[9] = 'e';
  joinResult.field_2._M_local_buf[10] = 'p';
  joinResult._M_string_length = 0xb;
  joinResult.field_2._M_local_buf[0xb] = '\0';
  test.field_2._M_local_buf[0] = 'm';
  test.field_2._M_local_buf[1] = -4;
  test.field_2._M_local_buf[2] = '\x12';
  test.field_2._M_local_buf[3] = '\0';
  test.field_2._M_local_buf[4] = '\0';
  test.field_2._M_local_buf[5] = '\0';
  test.field_2._M_local_buf[6] = '\0';
  test.field_2._M_local_buf[7] = '\0';
  test._M_dataplus._M_p = "";
  test._M_string_length = (size_type)anon_var_dwarf_8af4;
  expected_01._M_len = (size_type)password;
  expected_01._M_array = (iterator)0x3;
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  bVar37 = CheckSplitString::anon_class_1_0_00000001::operator()
                     ((anon_class_1_0_00000001 *)&joinResult,&test,expected_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  joinResult.field_2._M_allocated_capacity._0_2_ = 0x6e65;
  joinResult.field_2._M_local_buf[2] = 'd';
  joinResult.field_2._M_local_buf[3] = 's';
  joinResult.field_2._M_local_buf[4] = '/';
  joinResult.field_2._M_local_buf[5] = 's';
  joinResult.field_2._M_local_buf[6] = 'e';
  joinResult.field_2._M_local_buf[7] = 'p';
  joinResult.field_2._M_local_buf[8] = '/';
  joinResult.field_2._M_local_buf[9] = '\0';
  joinResult._M_string_length = 9;
  test.field_2._M_local_buf[0] = '\n';
  test.field_2._M_local_buf[1] = -3;
  test.field_2._M_local_buf[2] = '\x12';
  test.field_2._M_local_buf[3] = '\0';
  test.field_2._M_local_buf[4] = '\0';
  test.field_2._M_local_buf[5] = '\0';
  test.field_2._M_local_buf[6] = '\0';
  test.field_2._M_local_buf[7] = '\0';
  test._M_dataplus._M_p = "ends";
  test._M_string_length = (long)"/starts/sep" + 8;
  expected_02._M_len = (size_type)password;
  expected_02._M_array = (iterator)0x3;
  joinResult._M_dataplus._M_p = (pointer)&joinResult.field_2;
  bVar38 = CheckSplitString::anon_class_1_0_00000001::operator()
                     ((anon_class_1_0_00000001 *)&joinResult,&test,expected_02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)joinResult._M_dataplus._M_p != &joinResult.field_2) {
    operator_delete(joinResult._M_dataplus._M_p,
                    CONCAT17(joinResult.field_2._M_local_buf[7],
                             CONCAT16(joinResult.field_2._M_local_buf[6],
                                      CONCAT15(joinResult.field_2._M_local_buf[5],
                                               CONCAT14(joinResult.field_2._M_local_buf[4],
                                                        CONCAT13(joinResult.field_2._M_local_buf[3],
                                                                 CONCAT12(joinResult.field_2.
                                                                          _M_local_buf[2],
                                                                          joinResult.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_2_)))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)output._M_dataplus._M_p != &output.field_2) {
    operator_delete(output._M_dataplus._M_p,
                    CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                             output.field_2._M_local_buf[0]) + 1);
  }
  return (int)(byte)(local_509 &
                     ((bVar37 && bVar38) && (bVar35 && bVar36)) & (byte)local_60 & bVar52 & bVar57 &
                     (byte)local_94 & bVar33 & (byte)local_68 & bVar34 & (byte)local_6c & local_454
                     & (byte)local_70 &
                     (((bVar29 && bVar30) && bVar31) && bVar32) &
                     (((bVar25 && bVar26) && bVar27) && bVar28) &
                     (byte)uVar55 & bVar23 & bVar24 & ((bVar21 && bVar22) && (bVar19 && bVar20)) &
                     (((bVar16 && bVar17) && (bVar14 && bVar15)) && bVar18) &
                     (((bVar11 && bVar12) && bVar13) && ((bVar9 && bVar10) && (bVar7 && bVar8))) &
                     bVar6 & (byte)local_64 ^ 1);
}

Assistant:

int testSystemTools(int, char*[])
{
  bool res = true;

  int cc;
  for (cc = 0; toUnixPaths[cc][0]; cc++) {
    res &= CheckConvertToUnixSlashes(toUnixPaths[cc][0], toUnixPaths[cc][1]);
  }

  // Special check for ~
  std::string output;
  if (kwsys::SystemTools::GetEnv("HOME", output)) {
    output += "/foo bar/lala";
    res &= CheckConvertToUnixSlashes("~/foo bar/lala", output);
  }

  for (cc = 0; checkEscapeChars[cc][0]; cc++) {
    res &= CheckEscapeChars(checkEscapeChars[cc][0], checkEscapeChars[cc][1],
                            *checkEscapeChars[cc][2], checkEscapeChars[cc][3]);
  }

  res &= CheckFileOperations();

  res &= CheckStringOperations();

  res &= CheckEnvironmentOperations();

  res &= CheckRelativePaths();

  res &= CheckCollapsePath();

  res &= CheckGetPath();

  res &= CheckFind();

  res &= CheckIsSubDirectory();

  res &= CheckGetLineFromStream();

  res &= CheckGetLineFromStreamLongLine();

  res &= CheckGetFilenameName();

  res &= CheckTextFilesDiffer();

  res &= CheckCopyFileIfDifferent();

  res &= CheckURLParsing();

  res &= CheckSplitString();

  return res ? 0 : 1;
}